

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined8 uVar6;
  ulong uVar7;
  int *piVar8;
  Allocator *pAVar9;
  long *plVar10;
  size_t sVar11;
  size_t sVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  char cVar16;
  int i_6;
  Layer *pLVar17;
  byte bVar18;
  int i;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int j_2;
  uint uVar23;
  long lVar24;
  int j_3;
  uint inch;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  void *pvVar28;
  _func_int **pp_Var29;
  int q;
  undefined4 *puVar30;
  undefined4 *puVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  undefined8 *puVar35;
  void *pvVar36;
  int k;
  int iVar37;
  int k_5;
  long lVar38;
  int k_19;
  int j;
  _func_int **pp_Var39;
  ulong uVar40;
  int q_1;
  ulong uVar41;
  _func_int **pp_Var42;
  int j_4;
  undefined4 *puVar43;
  char cVar44;
  int j_6;
  ulong uVar45;
  _func_int *p_Var46;
  _func_int **pp_Var47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int out_elempack;
  ulong local_1a8;
  Option *local_190;
  ParamDict pd_5;
  undefined8 uStack_140;
  ParamDict pd;
  undefined1 local_128 [8];
  int local_120;
  Allocator *local_118;
  int iStack_110;
  int iStack_10c;
  size_t sStack_108;
  int local_100 [2];
  size_t local_f8 [2];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  size_t local_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  size_t sStack_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  long local_a0;
  long local_98;
  void *local_90;
  ModelBinFromMatArray local_88;
  long local_78;
  void *local_70;
  undefined8 local_68;
  long local_60;
  ulong local_58;
  long local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  pp_Var29 = this->_vptr_Convolution_x86_avx512;
  p_Var46 = pp_Var29[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var46) != 0) {
    return 0;
  }
  switch(*(undefined4 *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var46 + 4))) {
  case 1:
    pLVar17 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 2:
    pLVar17 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var46));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 3:
    pLVar17 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var46));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var46) + 4));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 4:
    pLVar17 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 5:
    pLVar17 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 6:
    pLVar17 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var46));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var46) + 4));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  default:
    pLVar17 = (Layer *)0x0;
    goto LAB_001ab405;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar17->_vptr_Layer[4])(pLVar17,opt);
  pp_Var29 = this->_vptr_Convolution_x86_avx512;
LAB_001ab405:
  this->activation = pLVar17;
  p_Var46 = pp_Var29[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var46) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
  iVar37 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
  uVar45 = (long)*(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var46) /
           (long)(iVar37 * iVar34);
  uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
  uVar41 = (ulong)(int)uVar33;
  uVar45 = (long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
           (long)(int)uVar33;
  uVar40 = uVar45 & 0xffffffff;
  inch = (uint)uVar45;
  if ((((iVar34 == iVar37 && opt->use_packing_layout == false) &&
       (iVar19 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46), iVar19 != 1))
      && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == iVar19)) &&
     ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
      (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) {
    pLVar17 = create_layer(6);
    this->convolution_dilation1 = pLVar17;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).h +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).d +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).c +
                           (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elempack +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,6,*(int *)(&(this->weight_winograd43_data).field_0x1c +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var29 = this->_vptr_Convolution_x86_avx512;
    if (*(int *)((long)&(this->weight_winograd43_data).elempack + (long)pp_Var29[-3]) == 0) {
      local_f8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_128 = SUB128(ZEXT812(0),4);
      local_120 = 0;
      local_118 = (Allocator *)0x0;
      iStack_110 = 0;
      local_100[0] = 0;
      p_Var46 = pp_Var29[-3];
      iStack_10c = pd.d._4_4_;
      sStack_108 = (size_t)local_128;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var46)) {
        piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        pd.d._0_4_ = (int)uVar6;
        pd.d._4_4_ = (int)((ulong)uVar6 >> 0x20);
        local_128 = *(undefined1 (*) [8])
                     ((long)&(this->weight_winograd63_data).cstep + (long)p_Var46);
        local_120 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var46);
        local_118 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46);
        sStack_108 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var46);
        iStack_110 = (int)uVar6;
        iStack_10c = (int)((ulong)uVar6 >> 0x20);
        local_100[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var46);
        local_f8[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var46);
      }
      pLVar17 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_88,(Mat *)&pd);
      (*pLVar17->_vptr_Layer[3])(pLVar17,&local_88);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_88);
      piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_118 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_118->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_f8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_128 = SUB128(ZEXT812(0),4);
      local_120 = 0;
      local_118 = (Allocator *)0x0;
      iStack_110 = 0;
      local_100[0] = 0;
      p_Var46 = pp_Var29[-3];
      iStack_10c = pd.d._4_4_;
      sStack_108 = (size_t)local_128;
      sStack_c0 = (size_t)local_128;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var46)) {
        piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
        pd.d._0_4_ = (int)uVar6;
        pd.d._4_4_ = (int)((ulong)uVar6 >> 0x20);
        local_128 = *(undefined1 (*) [8])
                     ((long)&(this->weight_winograd63_data).cstep + (long)p_Var46);
        local_120 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var46);
        local_118 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46);
        sStack_108 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var46);
        iStack_110 = (int)uVar6;
        iStack_10c = (int)((ulong)uVar6 >> 0x20);
        local_100[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var46);
        local_f8[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var46);
        p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      }
      local_b0 = 0;
      local_b8 = 0;
      uStack_c4 = 0;
      uStack_c8 = 0;
      local_d0 = 0;
      local_d8 = 0;
      uStack_e4 = 0;
      uStack_e8 = 0;
      local_f8[1] = 0;
      local_e0 = sStack_c0;
      if ((_func_int *)(local_f8 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).dims + (long)p_Var46)) {
        piVar8 = *(int **)((long)&(this->scale_in_data).h + (long)p_Var46);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        local_f8[1] = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var46);
        uVar6 = *(undefined8 *)((long)&(this->scale_in_data).h + (long)p_Var46);
        uStack_e8 = (undefined4)uVar6;
        uStack_e4 = (undefined4)((ulong)uVar6 >> 0x20);
        local_e0 = *(size_t *)((long)&(this->scale_in_data).c + (long)p_Var46);
        local_d8 = *(undefined4 *)((long)&(this->scale_in_data).cstep + (long)p_Var46);
        local_d0 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var46);
        sStack_c0 = *(size_t *)(&this->field_0x1d8 + (long)p_Var46);
        uStack_c8 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var46);
        uStack_c4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var46) >> 0x20)
        ;
        local_b8 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var46);
        local_b0 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var46);
      }
      pLVar17 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_88,(Mat *)&pd);
      (*pLVar17->_vptr_Layer[3])(pLVar17,&local_88);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_88);
      lVar27 = 0x48;
      do {
        piVar8 = *(int **)((long)&pd.d + lVar27);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (*(long **)((long)&local_118 + lVar27) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar27));
            }
            else {
              (**(code **)(**(long **)((long)&local_118 + lVar27) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_f8 + lVar27) = 0;
        *(undefined8 *)((long)&pd.d + lVar27 + 4) = 0;
        *(undefined8 *)(local_128 + lVar27 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar27) = 0;
        *(undefined8 *)((long)&pd.d + lVar27) = 0;
        *(undefined4 *)((long)local_100 + lVar27) = 0;
        *(undefined8 *)((long)&iStack_110 + lVar27) = 0;
        *(undefined8 *)((long)local_100 + lVar27 + -8) = 0;
        lVar27 = lVar27 + -0x48;
      } while (lVar27 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          plVar10 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var46);
          if (plVar10 == (long *)0x0) {
            free(*(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var46));
          }
          else {
            (**(code **)(*plVar10 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var46) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var46 + 4)) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var46) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var46) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  lVar27 = (long)(int)inch;
  uVar23 = (int)inch >> 0x1f;
  if (opt->use_packing_layout == false) {
    cVar44 = '\x01';
    cVar16 = '\x01';
LAB_001ab7a3:
    if ((cVar44 == '\x10') && (cVar16 == '\b')) {
      if ((iVar37 == 1 && iVar34 == 1) &&
         (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) ||
          (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
        iVar34 = 1;
        iVar37 = iVar34;
      }
      else if (opt->use_sgemm_convolution != true) {
        out_elempack = 8;
        goto LAB_001ac079;
      }
      convolution_im2col_sgemm_transform_kernel_pack16to8_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
      goto LAB_001ac082;
    }
    if ((cVar44 == '\x10') && (cVar16 == '\x04')) {
      if ((iVar37 == 1 && iVar34 == 1) &&
         (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) ||
          (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
        iVar34 = 1;
        iVar37 = iVar34;
      }
      else if (opt->use_sgemm_convolution != true) {
        out_elempack = 4;
        goto LAB_001ac079;
      }
      convolution_im2col_sgemm_transform_kernel_pack16to4_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
      goto LAB_001ac082;
    }
    if ((cVar44 == '\x10') && (cVar16 == '\x01')) {
      if (iVar34 != 3) {
        if (((iVar34 != 1) || (iVar37 != 1)) ||
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1))
              || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)))) &&
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 2)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 2))))))
        goto LAB_001ac049;
        iVar34 = 1;
        iVar37 = iVar34;
LAB_001ac064:
        convolution_im2col_sgemm_transform_kernel_pack16to1_avx512
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
        goto LAB_001ac082;
      }
      if (((iVar37 == 3) &&
          (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
          ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))))) {
        if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)) {
          pd_5._vptr_ParamDict = (_func_int **)0x0;
          pd_5.d._0_4_ = 0;
          pd_5.d._4_4_ = 0;
          uVar45 = 0;
          local_190 = opt;
          Mat::create((Mat *)&pd_5,0x40,inch,uVar33,4,(Allocator *)0x0);
          if ((int)inch < 1) {
            uVar40 = 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar33) {
            uVar20 = (ulong)uVar33;
          }
          for (; uVar45 != uVar20; uVar45 = uVar45 + 1) {
            lVar38 = (long)(int)(inch * 9 * (int)uVar45) * 4 +
                     *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
            for (uVar25 = 0; uVar25 != uVar40; uVar25 = uVar25 + 1) {
              lVar21 = uVar25 * 0x24;
              fVar2 = *(float *)(lVar38 + 0x18 + lVar21);
              uVar23 = *(uint *)(lVar38 + 0x1c + lVar21);
              uVar3 = *(uint *)(lVar38 + 0x20 + lVar21);
              auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 0x10 + lVar21)),0x10);
              auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 4 + lVar21)),0x10);
              auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 0x14 + lVar21)),0x10);
              for (lVar21 = 8; lVar21 != 0x68; lVar21 = lVar21 + 0xc) {
                uVar26 = *(ulong *)("N4ncnn22Convolution_x86_avx512E" + lVar21 + 0x1e);
                auVar63._8_8_ = 0;
                auVar63._0_8_ = uVar26;
                auVar77._0_4_ = (float)uVar26 * auVar14._0_4_;
                auVar77._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
                auVar77._8_4_ = auVar14._8_4_ * 0.0;
                auVar77._12_4_ = auVar14._12_4_ * 0.0;
                auVar81 = vshufps_avx(auVar77,auVar77,0xe1);
                auVar81 = vfmadd231ps_fma(auVar81,auVar63,auVar53);
                uVar4 = *(undefined4 *)((long)&DAT_004c6ac0 + lVar21);
                auVar91._4_4_ = uVar4;
                auVar91._0_4_ = uVar4;
                auVar91._8_4_ = uVar4;
                auVar91._12_4_ = uVar4;
                auVar81 = vfmadd231ps_fma(auVar81,auVar91,auVar54);
                uVar6 = vmovlps_avx(auVar81);
                *(undefined8 *)((long)&uStack_140 + lVar21) = uVar6;
                auVar81 = vmovshdup_avx(auVar63);
                auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar23),
                                          ZEXT416((uint)((float)uVar26 * fVar2)));
                auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar91);
                *(int *)((long)&pd._vptr_ParamDict + lVar21) = auVar81._0_4_;
              }
              pp_Var29 = pd_5._vptr_ParamDict;
              for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
                uVar23 = *(uint *)((long)&pd._vptr_ParamDict + lVar21 * 0xc);
                uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21 * 0xc + 4);
                puVar35 = (undefined8 *)((long)&DAT_004c6ac0 + 4);
                for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                  auVar49._0_4_ = (float)*puVar35 * (float)uVar6;
                  auVar49._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                  auVar49._8_8_ = 0;
                  auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar49,
                                            ZEXT416(uVar23));
                  auVar53 = vmovshdup_avx(auVar49);
                  *(float *)((long)pp_Var29 + lVar22 * 4) = auVar14._0_4_ + auVar53._0_4_;
                  puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                }
                pp_Var29 = pp_Var29 + 4;
              }
            }
          }
          Mat::create(&this->weight_winograd63_data,inch,0x40,((int)uVar33 / 8) * -7 + uVar33,0x20,8
                      ,(Allocator *)0x0);
          iVar34 = (this->weight_winograd63_data).w;
          pvVar28 = (this->weight_winograd63_data).data;
          sVar11 = (this->weight_winograd63_data).elemsize;
          sVar12 = (this->weight_winograd63_data).cstep;
          for (uVar45 = 0; (long)(uVar45 | 7) < (long)uVar41; uVar45 = uVar45 + 8) {
            lVar38 = 0;
            for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
              lVar22 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 3) * sVar12 * sVar11;
              for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar27; uVar40 = uVar40 + 0x10) {
                for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
                  for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                    *(undefined4 *)(lVar22 + lVar32) =
                         *(undefined4 *)(lVar38 + (long)pd_5._vptr_ParamDict);
                  }
                  lVar22 = lVar22 + 0x20;
                }
              }
              lVar38 = lVar38 + 4;
            }
          }
          iVar34 = (this->weight_winograd63_data).w;
          pvVar28 = (this->weight_winograd63_data).data;
          sVar11 = (this->weight_winograd63_data).elemsize;
          sVar12 = (this->weight_winograd63_data).cstep;
          for (; (long)uVar45 < (long)uVar41; uVar45 = uVar45 + 1) {
            pp_Var29 = pd_5._vptr_ParamDict;
            for (lVar38 = 0; lVar38 != 0x40; lVar38 = lVar38 + 1) {
              lVar21 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar38 +
                       (ulong)(((uint)uVar45 & 7) + ((uint)(uVar45 >> 3) & 0x1fffffff)) *
                       sVar12 * sVar11;
              for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar27; uVar40 = uVar40 + 0x10) {
                for (lVar22 = 0; lVar22 != 0x40; lVar22 = lVar22 + 4) {
                  *(undefined4 *)(lVar21 + lVar22) = *(undefined4 *)pp_Var29;
                }
                lVar21 = lVar21 + 0x40;
              }
              pp_Var29 = (_func_int **)((long)pp_Var29 + 4);
            }
          }
          piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
          opt = local_190;
          if (piVar8 == (int *)0x0) goto LAB_001ac082;
          LOCK();
          *piVar8 = *piVar8 + -1;
          iVar34 = *piVar8;
          UNLOCK();
joined_r0x001ae84c:
          pp_Var29 = pd_5._vptr_ParamDict;
          local_190 = opt;
          if (iVar34 != 0) goto LAB_001ac082;
          goto LAB_001b0ad7;
        }
        iVar34 = 3;
        iVar37 = iVar34;
      }
      else {
LAB_001ac049:
        if (opt->use_sgemm_convolution == true) goto LAB_001ac064;
      }
      out_elempack = 1;
LAB_001ac079:
      iVar19 = 0x10;
      goto LAB_001ac07b;
    }
    if ((cVar16 != '\b') || (cVar44 != '\b')) goto LAB_001ac22c;
    p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
    iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
    if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1))
       && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
      iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar34 = 1;
      iVar19 = iVar34;
LAB_001ac210:
      convolution_im2col_sgemm_transform_kernel_pack8_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
    }
    else {
      if ((opt->use_winograd_convolution != true) ||
         (((bVar13 = opt->use_winograd23_convolution, bVar13 == false &&
           (opt->use_winograd43_convolution == false)) && (opt->use_winograd63_convolution != true))
         )) {
        if (iVar34 == 2) goto LAB_001ac19b;
        if ((iVar34 == 3) &&
           (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 3))
        goto LAB_001ac120;
LAB_001ac1ed:
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
        if (opt->use_sgemm_convolution != true) {
LAB_001ac21d:
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_data_tm,inch,iVar37,iVar34,iVar19,8,8);
          goto LAB_001ac22c;
        }
        goto LAB_001ac210;
      }
      if (iVar34 == 2) {
LAB_001ac19b:
        if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 2) ||
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1)) ||
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1 ||
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1))))
        goto LAB_001ac1ed;
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 2;
        iVar19 = iVar34;
        goto LAB_001ac21d;
      }
      if ((iVar34 != 3) || (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3))
      goto LAB_001ac1ed;
      if ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1) ||
         (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1 ||
           (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1)) ||
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)))) {
LAB_001ac120:
        if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1) ||
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1 ||
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1))))
        goto LAB_001ac1ed;
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 3;
        iVar19 = iVar34;
        goto LAB_001ac21d;
      }
      if ((int)inch < 9) {
        if (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 9)
        goto LAB_001ac120;
        if (opt->use_winograd43_convolution == false) goto LAB_001b00a7;
        bVar18 = opt->use_winograd63_convolution;
LAB_001b0411:
        if (bVar18 != 0 || bVar13 != false) goto LAB_001b0419;
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
LAB_001b0789:
        local_f8[0] = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_128 = SUB168(ZEXT816(0),4);
        local_120 = 0;
        local_118 = (Allocator *)0x0;
        iStack_110 = 0;
        local_100[0] = 0;
        uVar20 = 0;
        local_190 = opt;
        iStack_10c = pd.d._4_4_;
        sStack_108 = (size_t)local_128;
        Mat::create((Mat *)&pd,0x24,inch,uVar33,4,(Allocator *)0x0);
        uVar41 = 0;
        if (0 < (int)inch) {
          uVar41 = uVar45 & 0xffffffff;
        }
        uVar45 = 0;
        if (0 < (int)uVar33) {
          uVar45 = (ulong)uVar33;
        }
        for (; uVar20 != uVar45; uVar20 = uVar20 + 1) {
          lVar38 = (long)(int)(inch * 9 * (int)uVar20) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          lVar21 = (long)iStack_10c * (long)local_128;
          pp_Var29 = (_func_int **)
                     ((long)local_128 * local_f8[0] * uVar20 + (long)pd._vptr_ParamDict);
          for (uVar25 = 0; uVar25 != uVar41; uVar25 = uVar25 + 1) {
            lVar22 = uVar25 * 0x24;
            fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
            uVar3 = *(uint *)(lVar38 + 0x1c + lVar22);
            uVar5 = *(uint *)(lVar38 + 0x20 + lVar22);
            auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                    ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                    ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
            auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                    ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
            for (lVar22 = 8; lVar22 != 0x50; lVar22 = lVar22 + 0xc) {
              uVar26 = *(ulong *)(&UNK_004c6b18 + lVar22);
              auVar76._8_8_ = 0;
              auVar76._0_8_ = uVar26;
              auVar90._0_4_ = (float)uVar26 * auVar14._0_4_;
              auVar90._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
              auVar90._8_4_ = auVar14._8_4_ * 0.0;
              auVar90._12_4_ = auVar14._12_4_ * 0.0;
              auVar81 = vshufps_avx(auVar90,auVar90,0xe1);
              auVar81 = vfmadd231ps_fma(auVar81,auVar76,auVar53);
              uVar4 = *(undefined4 *)((long)&DAT_004c6b20 + lVar22);
              auVar104._4_4_ = uVar4;
              auVar104._0_4_ = uVar4;
              auVar104._8_4_ = uVar4;
              auVar104._12_4_ = uVar4;
              auVar81 = vfmadd231ps_fma(auVar81,auVar104,auVar54);
              uVar6 = vmovlps_avx(auVar81);
              *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
              auVar81 = vmovshdup_avx(auVar76);
              auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                        ZEXT416((uint)((float)uVar26 * fVar2)));
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar104);
              *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
            }
            pp_Var39 = pp_Var29;
            for (lVar22 = 0; lVar22 != 6; lVar22 = lVar22 + 1) {
              uVar3 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
              uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
              puVar35 = (undefined8 *)((long)&DAT_004c6b20 + 4);
              for (lVar24 = 0; lVar24 != 6; lVar24 = lVar24 + 1) {
                auVar62._0_4_ = (float)*puVar35 * (float)uVar6;
                auVar62._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                auVar62._8_8_ = 0;
                auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar62,
                                          ZEXT416(uVar3));
                auVar53 = vmovshdup_avx(auVar62);
                *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
                puVar35 = (undefined8 *)((long)puVar35 + 0xc);
              }
              pp_Var39 = pp_Var39 + 3;
            }
            pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
          }
        }
        Mat::create(&this->weight_winograd43_data,(int)((long)((ulong)uVar23 << 0x20 | uVar40) / 8),
                    0x24,(int)uVar33 / 8,0x100,0x40,(Allocator *)0x0);
        iVar34 = (this->weight_winograd43_data).w;
        pvVar28 = (this->weight_winograd43_data).data;
        sVar11 = (this->weight_winograd43_data).elemsize;
        sVar12 = (this->weight_winograd43_data).cstep;
        for (uVar45 = 0; (long)(uVar45 | 7) < (long)(int)uVar33; uVar45 = uVar45 + 8) {
          lVar38 = 0;
          for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 1) {
            lVar22 = (long)pvVar28 +
                     (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 3) * sVar12 * sVar11;
            puVar43 = (undefined4 *)
                      (local_f8[0] * (long)local_128 * uVar45 + lVar38 + (long)pd._vptr_ParamDict);
            for (uVar41 = 0; (long)(uVar41 | 7) < lVar27; uVar41 = uVar41 + 8) {
              puVar30 = puVar43;
              for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
                puVar31 = puVar30;
                for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                  *(undefined4 *)(lVar22 + lVar32) = *puVar31;
                  puVar31 = (undefined4 *)((long)puVar31 + local_f8[0] * (long)local_128);
                }
                puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_10c * (long)local_128);
                lVar22 = lVar22 + 0x20;
              }
              puVar43 = puVar43 + (long)iStack_10c * (long)local_128 * 2;
            }
            lVar38 = lVar38 + 4;
          }
        }
        piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
        opt = local_190;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pp_Var29 = pd._vptr_ParamDict;
            if (local_118 == (Allocator *)0x0) goto LAB_001b0b13;
            (*local_118->_vptr_Allocator[3])();
            opt = local_190;
          }
        }
      }
      else {
        bVar18 = opt->use_winograd63_convolution;
        bVar48 = 0xf < inch;
        if (((bool)bVar18 == true) && (0xf < inch)) {
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          bVar48 = true;
          if (0x30 < uVar33 - 0x10) {
            bVar18 = 1;
            goto LAB_001b0074;
          }
          bVar18 = 1;
          if (0x40 < inch) goto LAB_001b0074;
LAB_001b00bb:
          local_1a8 = (ulong)uVar33;
          pd_5._vptr_ParamDict = (_func_int **)0x0;
          pd_5.d._0_4_ = 0;
          pd_5.d._4_4_ = 0;
          uVar20 = 0;
          local_190 = opt;
          Mat::create((Mat *)&pd_5,0x40,inch,uVar33,4,(Allocator *)0x0);
          uVar41 = 0;
          if (0 < (int)inch) {
            uVar41 = uVar45 & 0xffffffff;
          }
          uVar45 = 0;
          if (0 < (int)uVar33) {
            uVar45 = local_1a8;
          }
          for (; uVar20 != uVar45; uVar20 = uVar20 + 1) {
            lVar38 = (long)(int)(inch * 9 * (int)uVar20) * 4 +
                     *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
            for (uVar25 = 0; uVar25 != uVar41; uVar25 = uVar25 + 1) {
              lVar21 = uVar25 * 0x24;
              fVar2 = *(float *)(lVar38 + 0x18 + lVar21);
              uVar3 = *(uint *)(lVar38 + 0x1c + lVar21);
              uVar5 = *(uint *)(lVar38 + 0x20 + lVar21);
              auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 0x10 + lVar21)),0x10);
              auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 4 + lVar21)),0x10);
              auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 0x14 + lVar21)),0x10);
              for (lVar21 = 8; lVar21 != 0x68; lVar21 = lVar21 + 0xc) {
                uVar26 = *(ulong *)("N4ncnn22Convolution_x86_avx512E" + lVar21 + 0x1e);
                auVar74._8_8_ = 0;
                auVar74._0_8_ = uVar26;
                auVar88._0_4_ = (float)uVar26 * auVar14._0_4_;
                auVar88._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
                auVar88._8_4_ = auVar14._8_4_ * 0.0;
                auVar88._12_4_ = auVar14._12_4_ * 0.0;
                auVar81 = vshufps_avx(auVar88,auVar88,0xe1);
                auVar81 = vfmadd231ps_fma(auVar81,auVar74,auVar53);
                uVar4 = *(undefined4 *)((long)&DAT_004c6ac0 + lVar21);
                auVar102._4_4_ = uVar4;
                auVar102._0_4_ = uVar4;
                auVar102._8_4_ = uVar4;
                auVar102._12_4_ = uVar4;
                auVar81 = vfmadd231ps_fma(auVar81,auVar102,auVar54);
                uVar6 = vmovlps_avx(auVar81);
                *(undefined8 *)((long)&uStack_140 + lVar21) = uVar6;
                auVar81 = vmovshdup_avx(auVar74);
                auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                          ZEXT416((uint)((float)uVar26 * fVar2)));
                auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar102);
                *(int *)((long)&pd._vptr_ParamDict + lVar21) = auVar81._0_4_;
              }
              pp_Var29 = pd_5._vptr_ParamDict;
              for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
                uVar3 = *(uint *)((long)&pd._vptr_ParamDict + lVar21 * 0xc);
                uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21 * 0xc + 4);
                puVar35 = (undefined8 *)((long)&DAT_004c6ac0 + 4);
                for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                  auVar60._0_4_ = (float)*puVar35 * (float)uVar6;
                  auVar60._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                  auVar60._8_8_ = 0;
                  auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar60,
                                            ZEXT416(uVar3));
                  auVar53 = vmovshdup_avx(auVar60);
                  *(float *)((long)pp_Var29 + lVar22 * 4) = auVar14._0_4_ + auVar53._0_4_;
                  puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                }
                pp_Var29 = pp_Var29 + 4;
              }
            }
          }
          Mat::create(&this->weight_winograd63_data,
                      (int)((long)((ulong)uVar23 << 0x20 | uVar40) / 8),0x40,(int)uVar33 / 8,0x100,
                      0x40,(Allocator *)0x0);
          iVar34 = (this->weight_winograd63_data).w;
          pvVar28 = (this->weight_winograd63_data).data;
          sVar11 = (this->weight_winograd63_data).elemsize;
          sVar12 = (this->weight_winograd63_data).cstep;
          for (uVar45 = 0; (long)(uVar45 | 7) < (long)(int)uVar33; uVar45 = uVar45 + 8) {
            lVar38 = 0;
            for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
              lVar22 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 3) * sVar12 * sVar11;
              for (uVar41 = 0; (long)(uVar41 | 7) < lVar27; uVar41 = uVar41 + 8) {
                for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
                  for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                    *(undefined4 *)(lVar22 + lVar32) =
                         *(undefined4 *)(lVar38 + (long)pd_5._vptr_ParamDict);
                  }
                  lVar22 = lVar22 + 0x20;
                }
              }
              lVar38 = lVar38 + 4;
            }
          }
          piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
          opt = local_190;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            pp_Var29 = pd_5._vptr_ParamDict;
            if (*piVar8 == 0) {
LAB_001b0b13:
              free(pp_Var29);
              opt = local_190;
            }
          }
        }
        else {
LAB_001b0074:
          if (opt->use_winograd43_convolution == false) {
LAB_001b00a7:
            if (bVar13 == false) {
              uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
              goto LAB_001b00bb;
            }
          }
          else {
            if (!bVar48) goto LAB_001b0411;
            uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            if (((int)uVar33 < 0x10 & (bVar18 | bVar13)) == 0) goto LAB_001b0789;
          }
LAB_001b0419:
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          local_f8[0] = 0;
          pd._vptr_ParamDict = (_func_int **)0x0;
          pd.d._0_4_ = 0;
          pd.d._4_4_ = 0;
          local_128 = SUB168(ZEXT816(0),4);
          local_120 = 0;
          local_118 = (Allocator *)0x0;
          iStack_110 = 0;
          local_100[0] = 0;
          uVar20 = 0;
          local_190 = opt;
          iStack_10c = pd.d._4_4_;
          sStack_108 = (size_t)local_128;
          Mat::create((Mat *)&pd,0x10,inch,uVar33,4,(Allocator *)0x0);
          uVar41 = 0;
          if (0 < (int)inch) {
            uVar41 = uVar45 & 0xffffffff;
          }
          uVar45 = 0;
          if (0 < (int)uVar33) {
            uVar45 = (ulong)uVar33;
          }
          for (; uVar20 != uVar45; uVar20 = uVar20 + 1) {
            lVar38 = (long)(int)(inch * 9 * (int)uVar20) * 4 +
                     *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
            lVar21 = (long)iStack_10c * (long)local_128;
            pp_Var29 = (_func_int **)
                       ((long)local_128 * local_f8[0] * uVar20 + (long)pd._vptr_ParamDict);
            for (uVar25 = 0; uVar25 != uVar41; uVar25 = uVar25 + 1) {
              lVar22 = uVar25 * 0x24;
              fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
              uVar3 = *(uint *)(lVar38 + 0x1c + lVar22);
              uVar5 = *(uint *)(lVar38 + 0x20 + lVar22);
              auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                      ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
              auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                      ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
              auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                      ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
              for (lVar22 = 8; lVar22 != 0x38; lVar22 = lVar22 + 0xc) {
                uVar26 = *(ulong *)(&UNK_004c6b68 + lVar22);
                auVar75._8_8_ = 0;
                auVar75._0_8_ = uVar26;
                auVar89._0_4_ = (float)uVar26 * auVar14._0_4_;
                auVar89._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
                auVar89._8_4_ = auVar14._8_4_ * 0.0;
                auVar89._12_4_ = auVar14._12_4_ * 0.0;
                auVar81 = vshufps_avx(auVar89,auVar89,0xe1);
                auVar81 = vfmadd231ps_fma(auVar81,auVar75,auVar53);
                uVar4 = *(undefined4 *)((long)&DAT_004c6b70 + lVar22);
                auVar103._4_4_ = uVar4;
                auVar103._0_4_ = uVar4;
                auVar103._8_4_ = uVar4;
                auVar103._12_4_ = uVar4;
                auVar81 = vfmadd231ps_fma(auVar81,auVar103,auVar54);
                uVar6 = vmovlps_avx(auVar81);
                *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
                auVar81 = vmovshdup_avx(auVar75);
                auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                          ZEXT416((uint)((float)uVar26 * fVar2)));
                auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar103);
                *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
              }
              pp_Var39 = pp_Var29;
              for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                uVar3 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
                uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
                puVar35 = (undefined8 *)((long)&DAT_004c6b70 + 4);
                for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                  auVar61._0_4_ = (float)*puVar35 * (float)uVar6;
                  auVar61._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                  auVar61._8_8_ = 0;
                  auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar61,
                                            ZEXT416(uVar3));
                  auVar53 = vmovshdup_avx(auVar61);
                  *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
                  puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                }
                pp_Var39 = pp_Var39 + 2;
              }
              pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
            }
          }
          Mat::create(&this->weight_winograd23_data,
                      (int)((long)((ulong)uVar23 << 0x20 | uVar40) / 8),0x10,(int)uVar33 / 8,0x100,
                      0x40,(Allocator *)0x0);
          iVar34 = (this->weight_winograd23_data).w;
          pvVar28 = (this->weight_winograd23_data).data;
          sVar11 = (this->weight_winograd23_data).elemsize;
          sVar12 = (this->weight_winograd23_data).cstep;
          for (uVar45 = 0; (long)(uVar45 | 7) < (long)(int)uVar33; uVar45 = uVar45 + 8) {
            lVar38 = 0;
            for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
              lVar22 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 3) * sVar12 * sVar11;
              puVar43 = (undefined4 *)
                        (local_f8[0] * (long)local_128 * uVar45 + lVar38 + (long)pd._vptr_ParamDict)
              ;
              for (uVar41 = 0; (long)(uVar41 | 7) < lVar27; uVar41 = uVar41 + 8) {
                puVar30 = puVar43;
                for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
                  puVar31 = puVar30;
                  for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                    *(undefined4 *)(lVar22 + lVar32) = *puVar31;
                    puVar31 = (undefined4 *)((long)puVar31 + local_f8[0] * (long)local_128);
                  }
                  puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_10c * (long)local_128);
                  lVar22 = lVar22 + 0x20;
                }
                puVar43 = puVar43 + (long)iStack_10c * (long)local_128 * 2;
              }
              lVar38 = lVar38 + 4;
            }
          }
          piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
          opt = local_190;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              pp_Var29 = pd._vptr_ParamDict;
              if (local_118 == (Allocator *)0x0) goto LAB_001b0b13;
              (*local_118->_vptr_Allocator[3])();
              opt = local_190;
            }
          }
        }
      }
    }
LAB_001ac22c:
    if ((cVar16 == '\b') && (cVar44 == '\x04')) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1))
                || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1))
                     && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4))
                         == 2)) &&
                    (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2))))))
      {
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 1;
        iVar19 = iVar34;
      }
      else {
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_data_tm,inch,iVar37,iVar34,iVar19,4,8);
          goto LAB_001ac309;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
    }
LAB_001ac309:
    if ((cVar16 == '\b') && (cVar44 == '\x01')) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (iVar34 == 3) {
        if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 2))))))))
        goto LAB_001ac445;
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,inch,
                   *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),3,3,1,8);
      }
      else {
        if (((iVar34 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar34 = 1;
          iVar19 = iVar34;
        }
        else {
LAB_001ac445:
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
          if (opt->use_sgemm_convolution != true) {
            convolution_transform_kernel_packed_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                       &this->weight_data_tm,inch,iVar37,iVar34,iVar19,1,8);
            goto LAB_001ac489;
          }
        }
        convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
      }
    }
LAB_001ac489:
    if ((cVar16 == '\x04') && (cVar44 == '\b')) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1))
                || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                     (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1))
                    && ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4))
                         == 2 && (*(int *)((long)&(this->weight_winograd43_data).data +
                                          (long)p_Var46) == 2)))))))) {
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 1;
        iVar19 = iVar34;
      }
      else {
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_data_tm,inch,iVar37,iVar34,iVar19,8,4);
          goto LAB_001ac566;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
    }
LAB_001ac566:
    if ((cVar16 == '\x01') && (cVar44 == '\b')) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (iVar34 == 3) {
        if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1)) ||
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1 ||
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1))))
        goto LAB_001ac886;
        if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)) {
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          pd_5._vptr_ParamDict = (_func_int **)0x0;
          pd_5.d._0_4_ = 0;
          pd_5.d._4_4_ = 0;
          uVar41 = 0;
          local_190 = opt;
          Mat::create((Mat *)&pd_5,0x40,inch,uVar33,4,(Allocator *)0x0);
          uVar45 = 0;
          if (0 < (int)inch) {
            uVar45 = uVar40;
          }
          uVar20 = 0;
          if (0 < (int)uVar33) {
            uVar20 = (ulong)uVar33;
          }
          for (; uVar41 != uVar20; uVar41 = uVar41 + 1) {
            lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                     *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
            for (uVar25 = 0; uVar25 != uVar45; uVar25 = uVar25 + 1) {
              lVar21 = uVar25 * 0x24;
              fVar2 = *(float *)(lVar38 + 0x18 + lVar21);
              uVar3 = *(uint *)(lVar38 + 0x1c + lVar21);
              uVar5 = *(uint *)(lVar38 + 0x20 + lVar21);
              auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 0x10 + lVar21)),0x10);
              auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 4 + lVar21)),0x10);
              auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar21)),
                                      ZEXT416(*(uint *)(lVar38 + 0x14 + lVar21)),0x10);
              for (lVar21 = 8; lVar21 != 0x68; lVar21 = lVar21 + 0xc) {
                uVar26 = *(ulong *)("N4ncnn22Convolution_x86_avx512E" + lVar21 + 0x1e);
                auVar64._8_8_ = 0;
                auVar64._0_8_ = uVar26;
                auVar78._0_4_ = (float)uVar26 * auVar14._0_4_;
                auVar78._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
                auVar78._8_4_ = auVar14._8_4_ * 0.0;
                auVar78._12_4_ = auVar14._12_4_ * 0.0;
                auVar81 = vshufps_avx(auVar78,auVar78,0xe1);
                auVar81 = vfmadd231ps_fma(auVar81,auVar64,auVar53);
                uVar4 = *(undefined4 *)((long)&DAT_004c6ac0 + lVar21);
                auVar92._4_4_ = uVar4;
                auVar92._0_4_ = uVar4;
                auVar92._8_4_ = uVar4;
                auVar92._12_4_ = uVar4;
                auVar81 = vfmadd231ps_fma(auVar81,auVar92,auVar54);
                uVar6 = vmovlps_avx(auVar81);
                *(undefined8 *)((long)&uStack_140 + lVar21) = uVar6;
                auVar81 = vmovshdup_avx(auVar64);
                auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                          ZEXT416((uint)((float)uVar26 * fVar2)));
                auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar92);
                *(int *)((long)&pd._vptr_ParamDict + lVar21) = auVar81._0_4_;
              }
              pp_Var29 = pd_5._vptr_ParamDict;
              for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
                uVar3 = *(uint *)((long)&pd._vptr_ParamDict + lVar21 * 0xc);
                uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21 * 0xc + 4);
                puVar35 = (undefined8 *)((long)&DAT_004c6ac0 + 4);
                for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                  auVar50._0_4_ = (float)*puVar35 * (float)uVar6;
                  auVar50._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                  auVar50._8_8_ = 0;
                  auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar50,
                                            ZEXT416(uVar3));
                  auVar53 = vmovshdup_avx(auVar50);
                  *(float *)((long)pp_Var29 + lVar22 * 4) = auVar14._0_4_ + auVar53._0_4_;
                  puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                }
                pp_Var29 = pp_Var29 + 4;
              }
            }
          }
          Mat::create(&this->weight_winograd63_data,inch,0x40,((int)uVar33 / 8) * -7 + uVar33,0x20,8
                      ,(Allocator *)0x0);
          iVar34 = (this->weight_winograd63_data).w;
          pvVar28 = (this->weight_winograd63_data).data;
          sVar11 = (this->weight_winograd63_data).elemsize;
          sVar12 = (this->weight_winograd63_data).cstep;
          for (uVar45 = 0; (long)(uVar45 | 7) < (long)(int)uVar33; uVar45 = uVar45 + 8) {
            lVar38 = 0;
            for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
              lVar22 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 3) * sVar12 * sVar11;
              for (uVar41 = 0; (long)(uVar41 | 7) < lVar27; uVar41 = uVar41 + 8) {
                for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
                  for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 4) {
                    *(undefined4 *)(lVar22 + lVar32) =
                         *(undefined4 *)(lVar38 + (long)pd_5._vptr_ParamDict);
                  }
                  lVar22 = lVar22 + 0x20;
                }
              }
              lVar38 = lVar38 + 4;
            }
          }
          iVar34 = (this->weight_winograd63_data).w;
          pvVar28 = (this->weight_winograd63_data).data;
          sVar11 = (this->weight_winograd63_data).elemsize;
          sVar12 = (this->weight_winograd63_data).cstep;
          for (; (long)uVar45 < (long)(int)uVar33; uVar45 = uVar45 + 1) {
            pp_Var29 = pd_5._vptr_ParamDict;
            for (lVar38 = 0; lVar38 != 0x40; lVar38 = lVar38 + 1) {
              lVar21 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar38 +
                       (ulong)(((uint)uVar45 & 7) + ((uint)(uVar45 >> 3) & 0x1fffffff)) *
                       sVar12 * sVar11;
              for (uVar41 = 0; (long)(uVar41 | 7) < lVar27; uVar41 = uVar41 + 8) {
                for (lVar22 = 0; lVar22 != 0x20; lVar22 = lVar22 + 4) {
                  *(undefined4 *)(lVar21 + lVar22) = *(undefined4 *)pp_Var29;
                }
                lVar21 = lVar21 + 0x20;
              }
              pp_Var29 = (_func_int **)((long)pp_Var29 + 4);
            }
          }
          piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
          opt = local_190;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              free(pd_5._vptr_ParamDict);
              opt = local_190;
            }
          }
          goto LAB_001ac8c5;
        }
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 3;
        iVar37 = iVar34;
LAB_001ac8b6:
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,inch,iVar19,iVar34,iVar37,8,1);
      }
      else {
        if (((iVar34 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
          iVar19 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar34 = 1;
          iVar37 = iVar34;
        }
        else {
LAB_001ac886:
          iVar19 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
          if (opt->use_sgemm_convolution != true) goto LAB_001ac8b6;
        }
        convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,inch,iVar19,iVar34,iVar37);
      }
    }
LAB_001ac8c5:
    if ((cVar16 != '\x04') || (cVar44 != '\x04')) goto LAB_001acbc3;
    p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
    iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
    if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1))
       && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) ||
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
            ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
      iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar34 = 1;
      iVar19 = iVar34;
LAB_001acb8c:
      convolution_im2col_sgemm_transform_kernel_pack4_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
    }
    else if (opt->use_winograd_convolution == true) {
      bVar13 = opt->use_winograd23_convolution;
      if ((bVar13 == false) && (opt->use_winograd43_convolution == false)) {
        if ((iVar34 == 3) && (opt->use_winograd63_convolution != false)) goto LAB_001aca39;
        goto LAB_001acaf0;
      }
      if (iVar34 != 3) goto LAB_001acaf0;
LAB_001aca39:
      if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
           (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1)) ||
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1 ||
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1))))
      goto LAB_001acaf0;
      bVar48 = opt->use_winograd63_convolution;
      local_190 = opt;
      if ((((bVar48 == true) && (7 < (int)inch)) &&
          (uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),
          uVar33 - 8 < 0x19)) && (inch < 0x21)) {
LAB_001af1c7:
        local_1a8 = (ulong)uVar33;
        pd_5._vptr_ParamDict = (_func_int **)0x0;
        pd_5.d._0_4_ = 0;
        pd_5.d._4_4_ = 0;
        uVar41 = 0;
        Mat::create((Mat *)&pd_5,0x40,inch,uVar33,4,(Allocator *)0x0);
        uVar45 = 0;
        if (0 < (int)inch) {
          uVar45 = uVar40;
        }
        uVar20 = 0;
        if (0 < (int)uVar33) {
          uVar20 = local_1a8;
        }
        for (; uVar41 != uVar20; uVar41 = uVar41 + 1) {
          lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          for (uVar25 = 0; uVar25 != uVar45; uVar25 = uVar25 + 1) {
            lVar21 = uVar25 * 0x24;
            fVar2 = *(float *)(lVar38 + 0x18 + lVar21);
            uVar3 = *(uint *)(lVar38 + 0x1c + lVar21);
            uVar5 = *(uint *)(lVar38 + 0x20 + lVar21);
            auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar21)),
                                    ZEXT416(*(uint *)(lVar38 + 0x10 + lVar21)),0x10);
            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar21)),
                                    ZEXT416(*(uint *)(lVar38 + 4 + lVar21)),0x10);
            auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar21)),
                                    ZEXT416(*(uint *)(lVar38 + 0x14 + lVar21)),0x10);
            for (lVar21 = 8; lVar21 != 0x68; lVar21 = lVar21 + 0xc) {
              uVar26 = *(ulong *)("N4ncnn22Convolution_x86_avx512E" + lVar21 + 0x1e);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = uVar26;
              auVar85._0_4_ = (float)uVar26 * auVar14._0_4_;
              auVar85._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
              auVar85._8_4_ = auVar14._8_4_ * 0.0;
              auVar85._12_4_ = auVar14._12_4_ * 0.0;
              auVar81 = vshufps_avx(auVar85,auVar85,0xe1);
              auVar81 = vfmadd231ps_fma(auVar81,auVar71,auVar53);
              uVar4 = *(undefined4 *)((long)&DAT_004c6ac0 + lVar21);
              auVar99._4_4_ = uVar4;
              auVar99._0_4_ = uVar4;
              auVar99._8_4_ = uVar4;
              auVar99._12_4_ = uVar4;
              auVar81 = vfmadd231ps_fma(auVar81,auVar99,auVar54);
              uVar6 = vmovlps_avx(auVar81);
              *(undefined8 *)((long)&uStack_140 + lVar21) = uVar6;
              auVar81 = vmovshdup_avx(auVar71);
              auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                        ZEXT416((uint)((float)uVar26 * fVar2)));
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar99);
              *(int *)((long)&pd._vptr_ParamDict + lVar21) = auVar81._0_4_;
            }
            pp_Var29 = pd_5._vptr_ParamDict;
            for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
              uVar3 = *(uint *)((long)&pd._vptr_ParamDict + lVar21 * 0xc);
              uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21 * 0xc + 4);
              puVar35 = (undefined8 *)((long)&DAT_004c6ac0 + 4);
              for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                auVar57._0_4_ = (float)*puVar35 * (float)uVar6;
                auVar57._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                auVar57._8_8_ = 0;
                auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar57,
                                          ZEXT416(uVar3));
                auVar53 = vmovshdup_avx(auVar57);
                *(float *)((long)pp_Var29 + lVar22 * 4) = auVar14._0_4_ + auVar53._0_4_;
                puVar35 = (undefined8 *)((long)puVar35 + 0xc);
              }
              pp_Var29 = pp_Var29 + 4;
            }
          }
        }
        Mat::create(&this->weight_winograd63_data,(int)((long)((ulong)uVar23 << 0x20 | uVar40) / 4),
                    0x40,(int)uVar33 / 4,0x40,0x10,(Allocator *)0x0);
        iVar34 = (this->weight_winograd63_data).w;
        pvVar28 = (this->weight_winograd63_data).data;
        sVar11 = (this->weight_winograd63_data).elemsize;
        sVar12 = (this->weight_winograd63_data).cstep;
        for (uVar45 = 0; (long)(uVar45 | 3) < (long)(int)uVar33; uVar45 = uVar45 + 4) {
          lVar38 = 0;
          for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
            lVar22 = (long)pvVar28 +
                     (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 2) * sVar12 * sVar11;
            for (uVar41 = 0; (long)(uVar41 | 3) < lVar27; uVar41 = uVar41 + 4) {
              for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 4) {
                  *(undefined4 *)(lVar22 + lVar32) =
                       *(undefined4 *)(lVar38 + (long)pd_5._vptr_ParamDict);
                }
                lVar22 = lVar22 + 0x10;
              }
            }
            lVar38 = lVar38 + 4;
          }
        }
        piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        opt = local_190;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          pp_Var29 = pd_5._vptr_ParamDict;
          if (*piVar8 == 0) {
LAB_001b0aee:
            free(pp_Var29);
            opt = local_190;
          }
        }
      }
      else {
        if (opt->use_winograd43_convolution == false) {
          if (bVar13 != false) goto LAB_001af944;
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          goto LAB_001af1c7;
        }
        if (7 < (int)inch) {
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          if (((bVar13 | bVar48) != 1) || (7 < (int)uVar33)) goto LAB_001afcd1;
LAB_001af944:
          uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          local_f8[0] = 0;
          pd._vptr_ParamDict = (_func_int **)0x0;
          pd.d._0_4_ = 0;
          pd.d._4_4_ = 0;
          local_128 = SUB168(ZEXT816(0),4);
          local_120 = 0;
          local_118 = (Allocator *)0x0;
          iStack_110 = 0;
          local_100[0] = 0;
          uVar41 = 0;
          iStack_10c = pd.d._4_4_;
          sStack_108 = (size_t)local_128;
          Mat::create((Mat *)&pd,0x10,inch,uVar33,4,(Allocator *)0x0);
          uVar45 = 0;
          if (0 < (int)inch) {
            uVar45 = uVar40;
          }
          uVar20 = 0;
          if (0 < (int)uVar33) {
            uVar20 = (ulong)uVar33;
          }
          for (; uVar41 != uVar20; uVar41 = uVar41 + 1) {
            lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                     *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
            lVar21 = (long)iStack_10c * (long)local_128;
            pp_Var29 = (_func_int **)
                       ((long)local_128 * local_f8[0] * uVar41 + (long)pd._vptr_ParamDict);
            for (uVar25 = 0; uVar25 != uVar45; uVar25 = uVar25 + 1) {
              lVar22 = uVar25 * 0x24;
              fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
              uVar3 = *(uint *)(lVar38 + 0x1c + lVar22);
              uVar5 = *(uint *)(lVar38 + 0x20 + lVar22);
              auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                      ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
              auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                      ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
              auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                      ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
              for (lVar22 = 8; lVar22 != 0x38; lVar22 = lVar22 + 0xc) {
                uVar26 = *(ulong *)(&UNK_004c6b68 + lVar22);
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar26;
                auVar86._0_4_ = (float)uVar26 * auVar14._0_4_;
                auVar86._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
                auVar86._8_4_ = auVar14._8_4_ * 0.0;
                auVar86._12_4_ = auVar14._12_4_ * 0.0;
                auVar81 = vshufps_avx(auVar86,auVar86,0xe1);
                auVar81 = vfmadd231ps_fma(auVar81,auVar72,auVar53);
                uVar4 = *(undefined4 *)((long)&DAT_004c6b70 + lVar22);
                auVar100._4_4_ = uVar4;
                auVar100._0_4_ = uVar4;
                auVar100._8_4_ = uVar4;
                auVar100._12_4_ = uVar4;
                auVar81 = vfmadd231ps_fma(auVar81,auVar100,auVar54);
                uVar6 = vmovlps_avx(auVar81);
                *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
                auVar81 = vmovshdup_avx(auVar72);
                auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                          ZEXT416((uint)((float)uVar26 * fVar2)));
                auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar100);
                *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
              }
              pp_Var39 = pp_Var29;
              for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                uVar3 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
                uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
                puVar35 = (undefined8 *)((long)&DAT_004c6b70 + 4);
                for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                  auVar58._0_4_ = (float)*puVar35 * (float)uVar6;
                  auVar58._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                  auVar58._8_8_ = 0;
                  auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar58,
                                            ZEXT416(uVar3));
                  auVar53 = vmovshdup_avx(auVar58);
                  *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
                  puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                }
                pp_Var39 = pp_Var39 + 2;
              }
              pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
            }
          }
          Mat::create(&this->weight_winograd23_data,
                      (int)((long)((ulong)uVar23 << 0x20 | uVar40) / 4),0x10,(int)uVar33 / 4,0x40,
                      0x10,(Allocator *)0x0);
          iVar34 = (this->weight_winograd23_data).w;
          pvVar28 = (this->weight_winograd23_data).data;
          sVar11 = (this->weight_winograd23_data).elemsize;
          sVar12 = (this->weight_winograd23_data).cstep;
          for (uVar45 = 0; (long)(uVar45 | 3) < (long)(int)uVar33; uVar45 = uVar45 + 4) {
            lVar38 = 0;
            for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
              lVar22 = (long)pvVar28 +
                       (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 2) * sVar12 * sVar11;
              puVar43 = (undefined4 *)
                        (local_f8[0] * (long)local_128 * uVar45 + lVar38 + (long)pd._vptr_ParamDict)
              ;
              for (uVar41 = 0; (long)(uVar41 | 3) < lVar27; uVar41 = uVar41 + 4) {
                puVar30 = puVar43;
                for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                  puVar31 = puVar30;
                  for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 4) {
                    *(undefined4 *)(lVar22 + lVar32) = *puVar31;
                    puVar31 = (undefined4 *)((long)puVar31 + local_f8[0] * (long)local_128);
                  }
                  puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_10c * (long)local_128);
                  lVar22 = lVar22 + 0x10;
                }
                puVar43 = puVar43 + (long)iStack_10c * (long)local_128;
              }
              lVar38 = lVar38 + 4;
            }
          }
          piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
          opt = local_190;
          if (piVar8 == (int *)0x0) goto LAB_001acbc3;
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 != 0) goto LAB_001acbc3;
          pp_Var29 = pd._vptr_ParamDict;
          if (local_118 != (Allocator *)0x0) {
            (*local_118->_vptr_Allocator[3])();
            opt = local_190;
            goto LAB_001acbc3;
          }
          goto LAB_001b0aee;
        }
        if (bVar13 != false || bVar48 != false) goto LAB_001af944;
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
LAB_001afcd1:
        local_f8[0] = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_128 = SUB168(ZEXT816(0),4);
        local_120 = 0;
        local_118 = (Allocator *)0x0;
        iStack_110 = 0;
        local_100[0] = 0;
        uVar41 = 0;
        iStack_10c = pd.d._4_4_;
        sStack_108 = (size_t)local_128;
        Mat::create((Mat *)&pd,0x24,inch,uVar33,4,(Allocator *)0x0);
        uVar45 = 0;
        if (0 < (int)inch) {
          uVar45 = uVar40;
        }
        uVar20 = 0;
        if (0 < (int)uVar33) {
          uVar20 = (ulong)uVar33;
        }
        for (; uVar41 != uVar20; uVar41 = uVar41 + 1) {
          lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          lVar21 = (long)iStack_10c * (long)local_128;
          pp_Var29 = (_func_int **)
                     ((long)local_128 * local_f8[0] * uVar41 + (long)pd._vptr_ParamDict);
          for (uVar25 = 0; uVar25 != uVar45; uVar25 = uVar25 + 1) {
            lVar22 = uVar25 * 0x24;
            fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
            uVar3 = *(uint *)(lVar38 + 0x1c + lVar22);
            uVar5 = *(uint *)(lVar38 + 0x20 + lVar22);
            auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                    ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                    ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
            auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                    ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
            for (lVar22 = 8; lVar22 != 0x50; lVar22 = lVar22 + 0xc) {
              uVar26 = *(ulong *)(&UNK_004c6b18 + lVar22);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar26;
              auVar87._0_4_ = (float)uVar26 * auVar14._0_4_;
              auVar87._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
              auVar87._8_4_ = auVar14._8_4_ * 0.0;
              auVar87._12_4_ = auVar14._12_4_ * 0.0;
              auVar81 = vshufps_avx(auVar87,auVar87,0xe1);
              auVar81 = vfmadd231ps_fma(auVar81,auVar73,auVar53);
              uVar4 = *(undefined4 *)((long)&DAT_004c6b20 + lVar22);
              auVar101._4_4_ = uVar4;
              auVar101._0_4_ = uVar4;
              auVar101._8_4_ = uVar4;
              auVar101._12_4_ = uVar4;
              auVar81 = vfmadd231ps_fma(auVar81,auVar101,auVar54);
              uVar6 = vmovlps_avx(auVar81);
              *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
              auVar81 = vmovshdup_avx(auVar73);
              auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar3),
                                        ZEXT416((uint)((float)uVar26 * fVar2)));
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar5),auVar101);
              *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
            }
            pp_Var39 = pp_Var29;
            for (lVar22 = 0; lVar22 != 6; lVar22 = lVar22 + 1) {
              uVar3 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
              uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
              puVar35 = (undefined8 *)((long)&DAT_004c6b20 + 4);
              for (lVar24 = 0; lVar24 != 6; lVar24 = lVar24 + 1) {
                auVar59._0_4_ = (float)*puVar35 * (float)uVar6;
                auVar59._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                auVar59._8_8_ = 0;
                auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar59,
                                          ZEXT416(uVar3));
                auVar53 = vmovshdup_avx(auVar59);
                *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
                puVar35 = (undefined8 *)((long)puVar35 + 0xc);
              }
              pp_Var39 = pp_Var39 + 3;
            }
            pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
          }
        }
        Mat::create(&this->weight_winograd43_data,(int)((long)((ulong)uVar23 << 0x20 | uVar40) / 4),
                    0x24,(int)uVar33 / 4,0x40,0x10,(Allocator *)0x0);
        iVar34 = (this->weight_winograd43_data).w;
        pvVar28 = (this->weight_winograd43_data).data;
        sVar11 = (this->weight_winograd43_data).elemsize;
        sVar12 = (this->weight_winograd43_data).cstep;
        for (uVar45 = 0; (long)(uVar45 | 3) < (long)(int)uVar33; uVar45 = uVar45 + 4) {
          lVar38 = 0;
          for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 1) {
            lVar22 = (long)pvVar28 +
                     (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 2) * sVar12 * sVar11;
            puVar43 = (undefined4 *)
                      (local_f8[0] * (long)local_128 * uVar45 + lVar38 + (long)pd._vptr_ParamDict);
            for (uVar41 = 0; (long)(uVar41 | 3) < lVar27; uVar41 = uVar41 + 4) {
              puVar30 = puVar43;
              for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                puVar31 = puVar30;
                for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 4) {
                  *(undefined4 *)(lVar22 + lVar32) = *puVar31;
                  puVar31 = (undefined4 *)((long)puVar31 + local_f8[0] * (long)local_128);
                }
                puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_10c * (long)local_128);
                lVar22 = lVar22 + 0x10;
              }
              puVar43 = puVar43 + (long)iStack_10c * (long)local_128;
            }
            lVar38 = lVar38 + 4;
          }
        }
        piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
        opt = local_190;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pp_Var29 = pd._vptr_ParamDict;
            if (local_118 == (Allocator *)0x0) goto LAB_001b0aee;
            (*local_118->_vptr_Allocator[3])();
            opt = local_190;
          }
        }
      }
    }
    else {
LAB_001acaf0:
      iVar37 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46);
      if (iVar37 == 1) {
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
        if (iVar37 == 1) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) &&
              ((0xb < (int)inch ||
               (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46))))) ||
             (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) ||
               (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46))) &&
              ((0xf < (int)inch ||
               (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46)))))))
          goto LAB_001acb58;
        }
        else {
LAB_001acb4e:
          if (1 < iVar37) goto LAB_001acb53;
        }
      }
      else {
        if (iVar37 < 2) {
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
          goto LAB_001acb4e;
        }
LAB_001acb53:
        if ((int)inch < 0x10) {
          bVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 0x10;
        }
        else {
LAB_001acb58:
          bVar13 = false;
        }
        if ((opt->use_sgemm_convolution == true) && (!bVar13)) {
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
          goto LAB_001acb8c;
        }
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_data_tm,inch,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),iVar34,
                 *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46),4,4);
    }
LAB_001acbc3:
    if ((cVar16 == '\x04') && (cVar44 == '\x01')) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (iVar34 == 3) {
        if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) != 3) ||
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 2))))))))
        goto LAB_001accf1;
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 3;
        iVar19 = iVar34;
      }
      else {
        if (((iVar34 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))) {
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
          iVar34 = 1;
          iVar19 = iVar34;
LAB_001acd90:
          convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                     &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
          goto LAB_001acdc9;
        }
LAB_001accf1:
        iVar37 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46);
        if (iVar37 == 1) {
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
          if (iVar37 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) &&
                ((0xb < (int)inch ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46))) &&
                ((0xf < (int)inch ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46)))))))
            goto LAB_001acd59;
          }
          else {
LAB_001acd4f:
            if (1 < iVar37) goto LAB_001acd54;
          }
        }
        else {
          if (iVar37 < 2) {
            iVar37 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
            goto LAB_001acd4f;
          }
LAB_001acd54:
          if ((int)inch < 0x10) {
            bVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 0x10;
          }
          else {
LAB_001acd59:
            bVar13 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar13)) {
            iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
            goto LAB_001acd90;
          }
        }
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_data_tm,inch,iVar37,iVar34,iVar19,1,4);
    }
LAB_001acdc9:
    uVar6 = local_68;
    if ((cVar16 == '\x01') && (cVar44 == '\x04')) {
      p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
      iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
      if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1))
                || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                     (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1))
                    && ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4))
                         == 2 && (*(int *)((long)&(this->weight_winograd43_data).data +
                                          (long)p_Var46) == 2)))))))) {
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 1;
        iVar19 = iVar34;
LAB_001ad174:
        convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
        uVar6 = local_68;
      }
      else if (((opt->use_winograd_convolution == true) && (iVar34 == 3)) &&
              ((opt->use_winograd63_convolution != false &&
               ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 3 &&
                  (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
                ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1))))))
              )) {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        pd_5._vptr_ParamDict = (_func_int **)0x0;
        pd_5.d._0_4_ = 0;
        pd_5.d._4_4_ = 0;
        uVar41 = 0;
        local_190 = opt;
        Mat::create((Mat *)&pd_5,0x40,inch,uVar33,4,(Allocator *)0x0);
        local_78 = (long)(int)uVar33;
        uVar45 = 0;
        if (0 < (int)inch) {
          uVar45 = uVar40;
        }
        uVar20 = 0;
        if (0 < (int)uVar33) {
          uVar20 = (ulong)uVar33;
        }
        for (; uVar41 != uVar20; uVar41 = uVar41 + 1) {
          lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          for (uVar25 = 0; uVar25 != uVar45; uVar25 = uVar25 + 1) {
            lVar21 = uVar25 * 0x24;
            fVar2 = *(float *)(lVar38 + 0x18 + lVar21);
            uVar23 = *(uint *)(lVar38 + 0x1c + lVar21);
            uVar3 = *(uint *)(lVar38 + 0x20 + lVar21);
            auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar21)),
                                    ZEXT416(*(uint *)(lVar38 + 0x10 + lVar21)),0x10);
            auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar21)),
                                    ZEXT416(*(uint *)(lVar38 + 4 + lVar21)),0x10);
            auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar21)),
                                    ZEXT416(*(uint *)(lVar38 + 0x14 + lVar21)),0x10);
            for (lVar21 = 8; lVar21 != 0x68; lVar21 = lVar21 + 0xc) {
              uVar26 = *(ulong *)("N4ncnn22Convolution_x86_avx512E" + lVar21 + 0x1e);
              auVar65._8_8_ = 0;
              auVar65._0_8_ = uVar26;
              auVar79._0_4_ = (float)uVar26 * auVar14._0_4_;
              auVar79._4_4_ = (float)(uVar26 >> 0x20) * auVar14._4_4_;
              auVar79._8_4_ = auVar14._8_4_ * 0.0;
              auVar79._12_4_ = auVar14._12_4_ * 0.0;
              auVar81 = vshufps_avx(auVar79,auVar79,0xe1);
              auVar81 = vfmadd231ps_fma(auVar81,auVar65,auVar53);
              uVar4 = *(undefined4 *)((long)&DAT_004c6ac0 + lVar21);
              auVar93._4_4_ = uVar4;
              auVar93._0_4_ = uVar4;
              auVar93._8_4_ = uVar4;
              auVar93._12_4_ = uVar4;
              auVar81 = vfmadd231ps_fma(auVar81,auVar93,auVar54);
              uVar6 = vmovlps_avx(auVar81);
              *(undefined8 *)((long)&uStack_140 + lVar21) = uVar6;
              auVar81 = vmovshdup_avx(auVar65);
              auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar23),
                                        ZEXT416((uint)((float)uVar26 * fVar2)));
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar93);
              *(int *)((long)&pd._vptr_ParamDict + lVar21) = auVar81._0_4_;
            }
            pp_Var29 = pd_5._vptr_ParamDict;
            for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
              uVar23 = *(uint *)((long)&pd._vptr_ParamDict + lVar21 * 0xc);
              uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21 * 0xc + 4);
              puVar35 = (undefined8 *)((long)&DAT_004c6ac0 + 4);
              for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                auVar51._0_4_ = (float)*puVar35 * (float)uVar6;
                auVar51._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                auVar51._8_8_ = 0;
                auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar51,
                                          ZEXT416(uVar23));
                auVar53 = vmovshdup_avx(auVar51);
                *(float *)((long)pp_Var29 + lVar22 * 4) = auVar14._0_4_ + auVar53._0_4_;
                puVar35 = (undefined8 *)((long)puVar35 + 0xc);
              }
              pp_Var29 = pp_Var29 + 4;
            }
          }
        }
        Mat::create(&this->weight_winograd63_data,inch,0x40,((int)uVar33 / 4) * -3 + uVar33,0x10,4,
                    (Allocator *)0x0);
        sVar11 = (this->weight_winograd63_data).elemsize;
        local_60 = (this->weight_winograd63_data).cstep * sVar11;
        local_50 = (long)(this->weight_winograd63_data).w * sVar11;
        local_68 = 0;
        local_70 = (this->weight_winograd63_data).data;
        local_a0 = 0;
        uVar45 = 0;
        while (uVar41 = uVar45, (long)(uVar41 | 3) < local_78) {
          local_48 = (void *)((uVar41 >> 2) * local_60 + (long)local_70);
          lVar38 = 0;
          lVar21 = local_a0;
          while (lVar24 = lVar21, lVar22 = lVar38, lVar22 != 0x40) {
            puVar43 = (undefined4 *)(local_50 * lVar22 + (long)local_48);
            for (lVar38 = 3; lVar38 < lVar27; lVar38 = lVar38 + 4) {
              *puVar43 = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[1] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[2] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[3] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[4] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[5] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[6] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[7] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[8] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[9] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[10] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[0xb] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[0xc] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[0xd] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[0xe] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43[0xf] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar24);
              puVar43 = puVar43 + 0x10;
            }
            lVar21 = lVar24 + 4;
            local_40 = lVar22;
            local_38 = lVar24;
            lVar38 = lVar22 + 1;
          }
          local_58 = uVar41;
          uVar45 = uVar41 + 4;
        }
        iVar34 = (this->weight_winograd63_data).w;
        local_90 = (this->weight_winograd63_data).data;
        sVar11 = (this->weight_winograd63_data).elemsize;
        local_98 = (this->weight_winograd63_data).cstep * sVar11;
        uVar45 = uVar41 & 0xffffffff;
        for (; (long)uVar41 < local_78; uVar41 = uVar41 + 1) {
          pvVar28 = (void *)((ulong)(((uint)uVar45 & 3) + (int)(uVar45 >> 2)) * local_98 +
                            (long)local_90);
          pp_Var29 = pd_5._vptr_ParamDict;
          pp_Var39 = pd_5._vptr_ParamDict;
          pp_Var42 = pd_5._vptr_ParamDict;
          pp_Var47 = pd_5._vptr_ParamDict;
          for (lVar38 = 0; lVar21 = 3, lVar38 != 0x40; lVar38 = lVar38 + 1) {
            for (; lVar21 < lVar27; lVar21 = lVar21 + 4) {
              *(undefined4 *)((long)pvVar28 + lVar21 * 4 + -0xc) = *(undefined4 *)pp_Var39;
              *(undefined4 *)((long)pvVar28 + lVar21 * 4 + -8) = *(undefined4 *)pp_Var42;
              *(undefined4 *)((long)pvVar28 + lVar21 * 4 + -4) = *(undefined4 *)pp_Var29;
              *(undefined4 *)((long)pvVar28 + lVar21 * 4) = *(undefined4 *)pp_Var47;
            }
            pp_Var29 = (_func_int **)((long)pp_Var29 + 4);
            pp_Var42 = (_func_int **)((long)pp_Var42 + 4);
            pp_Var39 = (_func_int **)((long)pp_Var39 + 4);
            pp_Var47 = (_func_int **)((long)pp_Var47 + 4);
            pvVar28 = (void *)((long)pvVar28 + (long)iVar34 * sVar11);
          }
          uVar45 = (ulong)((uint)uVar45 + 1);
        }
        piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        opt = local_190;
        uVar6 = 0;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          uVar6 = local_68;
          if (*piVar8 == 0) {
            local_68 = 0;
            free(pd_5._vptr_ParamDict);
            opt = local_190;
            uVar6 = local_68;
          }
        }
      }
      else {
        iVar37 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46);
        if (iVar37 == 1) {
          iVar37 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
          if (iVar37 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) &&
                ((0xb < (int)inch ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46))) &&
                ((0xf < (int)inch ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46)))))))
            goto LAB_001ad13e;
          }
          else {
LAB_001ad134:
            if (1 < iVar37) goto LAB_001ad139;
          }
        }
        else {
          if (iVar37 < 2) {
            iVar37 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46);
            goto LAB_001ad134;
          }
LAB_001ad139:
          if ((int)inch < 0x10) {
            bVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46) < 0x10;
          }
          else {
LAB_001ad13e:
            bVar13 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar13)) {
            iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
            goto LAB_001ad174;
          }
        }
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_data_tm,inch,
                   *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46),iVar34,
                   *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46),4,1);
        uVar6 = local_68;
      }
    }
    local_68 = uVar6;
    if ((cVar16 != '\x01') || (cVar44 != '\x01')) goto LAB_001ac082;
    p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
    iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var46);
    if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1))
       && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)) ||
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
            ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
      iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar19 = 1;
      iVar34 = iVar19;
    }
    else {
      if (opt->use_winograd_convolution == true) {
        bVar18 = opt->use_winograd23_convolution;
        if ((bool)bVar18 == false) {
          if ((iVar34 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_001ad28a;
        }
        else if (iVar34 == 3) {
LAB_001ad28a:
          if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 3) &&
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) {
            uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
            lVar27 = (long)(int)uVar33;
            if ((opt->use_winograd43_convolution == true) && (0xf < (int)inch)) {
              bVar18 = (int)uVar33 < 0x10 & bVar18;
            }
            local_190 = opt;
            if (bVar18 == 0) {
              local_f8[0] = 0;
              pd._vptr_ParamDict = (_func_int **)0x0;
              pd.d._0_4_ = 0;
              pd.d._4_4_ = 0;
              local_128 = SUB168(ZEXT816(0),4);
              local_120 = 0;
              local_118 = (Allocator *)0x0;
              iStack_110 = 0;
              local_100[0] = 0;
              uVar41 = 0;
              iStack_10c = pd.d._4_4_;
              sStack_108 = (size_t)local_128;
              Mat::create((Mat *)&pd,0x24,inch,uVar33,4,(Allocator *)0x0);
              uVar45 = 0;
              if (0 < (int)inch) {
                uVar45 = uVar40;
              }
              uVar40 = 0;
              if (0 < (int)uVar33) {
                uVar40 = (ulong)uVar33;
              }
              for (; uVar41 != uVar40; uVar41 = uVar41 + 1) {
                lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                         *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
                lVar21 = (long)iStack_10c * (long)local_128;
                pp_Var29 = (_func_int **)
                           ((long)local_128 * local_f8[0] * uVar41 + (long)pd._vptr_ParamDict);
                for (uVar20 = 0; uVar20 != uVar45; uVar20 = uVar20 + 1) {
                  lVar22 = uVar20 * 0x24;
                  fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
                  uVar23 = *(uint *)(lVar38 + 0x1c + lVar22);
                  uVar3 = *(uint *)(lVar38 + 0x20 + lVar22);
                  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                          ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
                  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                          ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
                  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                          ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
                  for (lVar22 = 8; lVar22 != 0x50; lVar22 = lVar22 + 0xc) {
                    uVar25 = *(ulong *)(&UNK_004c6b18 + lVar22);
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = uVar25;
                    auVar80._0_4_ = (float)uVar25 * auVar14._0_4_;
                    auVar80._4_4_ = (float)(uVar25 >> 0x20) * auVar14._4_4_;
                    auVar80._8_4_ = auVar14._8_4_ * 0.0;
                    auVar80._12_4_ = auVar14._12_4_ * 0.0;
                    auVar81 = vshufps_avx(auVar80,auVar80,0xe1);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar66,auVar53);
                    uVar4 = *(undefined4 *)((long)&DAT_004c6b20 + lVar22);
                    auVar94._4_4_ = uVar4;
                    auVar94._0_4_ = uVar4;
                    auVar94._8_4_ = uVar4;
                    auVar94._12_4_ = uVar4;
                    auVar81 = vfmadd231ps_fma(auVar81,auVar94,auVar54);
                    uVar6 = vmovlps_avx(auVar81);
                    *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
                    auVar81 = vmovshdup_avx(auVar66);
                    auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar23),
                                              ZEXT416((uint)((float)uVar25 * fVar2)));
                    auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar94);
                    *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
                  }
                  pp_Var39 = pp_Var29;
                  for (lVar22 = 0; lVar22 != 6; lVar22 = lVar22 + 1) {
                    uVar23 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
                    uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
                    puVar35 = (undefined8 *)((long)&DAT_004c6b20 + 4);
                    for (lVar24 = 0; lVar24 != 6; lVar24 = lVar24 + 1) {
                      auVar52._0_4_ = (float)*puVar35 * (float)uVar6;
                      auVar52._4_4_ =
                           (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                      auVar52._8_8_ = 0;
                      auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar52,
                                                ZEXT416(uVar23));
                      auVar53 = vmovshdup_avx(auVar52);
                      *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
                      puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                    }
                    pp_Var39 = pp_Var39 + 3;
                  }
                  pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
                }
              }
              Mat::create(&this->weight_winograd43_data,inch << 3,0x24,
                          (int)uVar33 / 8 + (int)uVar33 % 4 +
                          (int)(char)((char)((long)(int)uVar33 % 8) / '\x04'),4,(Allocator *)0x0);
              iVar34 = (this->weight_winograd43_data).w;
              pvVar28 = (this->weight_winograd43_data).data;
              sVar11 = (this->weight_winograd43_data).elemsize;
              sVar12 = (this->weight_winograd43_data).cstep;
              for (uVar40 = 0; (long)(uVar40 | 7) < lVar27; uVar40 = uVar40 + 8) {
                lVar38 = 0;
                for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 1) {
                  lVar22 = (long)pvVar28 +
                           (long)iVar34 * sVar11 * lVar21 + (uVar40 >> 3) * sVar12 * sVar11;
                  puVar43 = (undefined4 *)
                            ((long)local_128 * local_f8[0] * uVar40 + lVar38 +
                            (long)pd._vptr_ParamDict);
                  for (uVar41 = 0; uVar41 != uVar45; uVar41 = uVar41 + 1) {
                    puVar30 = puVar43;
                    for (lVar24 = 0; lVar24 != 0x20; lVar24 = lVar24 + 4) {
                      *(undefined4 *)(lVar22 + lVar24) = *puVar30;
                      puVar30 = (undefined4 *)((long)puVar30 + (long)local_128 * local_f8[0]);
                    }
                    puVar43 = (undefined4 *)((long)puVar43 + (long)iStack_10c * (long)local_128);
                    lVar22 = lVar22 + 0x20;
                  }
                  lVar38 = lVar38 + 4;
                }
              }
              iVar34 = (this->weight_winograd43_data).w;
              pvVar28 = (this->weight_winograd43_data).data;
              sVar11 = (this->weight_winograd43_data).elemsize;
              sVar12 = (this->weight_winograd43_data).cstep;
              for (; (long)(uVar40 | 3) < lVar27; uVar40 = uVar40 + 4) {
                lVar38 = 0;
                for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 1) {
                  lVar22 = (long)pvVar28 +
                           (long)iVar34 * sVar11 * lVar21 +
                           (ulong)(((uint)(uVar40 >> 3) & 0x1fffffff) +
                                  (uint)(((uint)uVar40 >> 2 & 1) != 0)) * sVar12 * sVar11;
                  puVar43 = (undefined4 *)
                            ((long)local_128 * local_f8[0] * uVar40 + lVar38 +
                            (long)pd._vptr_ParamDict);
                  for (uVar41 = 0; uVar41 != uVar45; uVar41 = uVar41 + 1) {
                    puVar30 = puVar43;
                    for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 4) {
                      *(undefined4 *)(lVar22 + lVar24) = *puVar30;
                      puVar30 = (undefined4 *)((long)puVar30 + (long)local_128 * local_f8[0]);
                    }
                    puVar43 = (undefined4 *)((long)puVar43 + (long)iStack_10c * (long)local_128);
                    lVar22 = lVar22 + 0x10;
                  }
                  lVar38 = lVar38 + 4;
                }
              }
              iVar34 = (this->weight_winograd43_data).w;
              pvVar28 = (this->weight_winograd43_data).data;
              sVar11 = (this->weight_winograd43_data).elemsize;
              sVar12 = (this->weight_winograd43_data).cstep;
              uVar41 = uVar40 & 0xffffffff;
              while( true ) {
                uVar33 = (uint)uVar41;
                if (lVar27 <= (long)uVar40) break;
                pvVar36 = (void *)((ulong)((uVar33 & 3) + (int)(uVar41 >> 3) +
                                          (uint)((uVar33 >> 2 & 1) != 0)) * sVar11 * sVar12 +
                                  (long)pvVar28);
                lVar38 = 0;
                for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 1) {
                  puVar43 = (undefined4 *)
                            (local_f8[0] * uVar40 * (long)local_128 + lVar38 +
                            (long)pd._vptr_ParamDict);
                  for (uVar41 = 0; uVar45 != uVar41; uVar41 = uVar41 + 1) {
                    *(undefined4 *)((long)pvVar36 + uVar41 * 4) = *puVar43;
                    puVar43 = (undefined4 *)((long)puVar43 + (long)iStack_10c * (long)local_128);
                  }
                  lVar38 = lVar38 + 4;
                  pvVar36 = (void *)((long)pvVar36 + (long)iVar34 * sVar11);
                }
                uVar40 = uVar40 + 1;
                uVar41 = (ulong)(uVar33 + 1);
              }
              piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
              opt = local_190;
              if (piVar8 == (int *)0x0) goto LAB_001ac082;
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 != 0) goto LAB_001ac082;
              pp_Var29 = pd._vptr_ParamDict;
              if (local_118 != (Allocator *)0x0) {
                (*local_118->_vptr_Allocator[3])();
                opt = local_190;
                goto LAB_001ac082;
              }
            }
            else {
              local_f8[0] = 0;
              pd._vptr_ParamDict = (_func_int **)0x0;
              pd.d._0_4_ = 0;
              pd.d._4_4_ = 0;
              local_128 = SUB168(ZEXT816(0),4);
              local_120 = 0;
              local_118 = (Allocator *)0x0;
              iStack_110 = 0;
              local_100[0] = 0;
              uVar41 = 0;
              iStack_10c = pd.d._4_4_;
              sStack_108 = (size_t)local_128;
              Mat::create((Mat *)&pd,0x10,inch,uVar33,4,(Allocator *)0x0);
              uVar45 = 0;
              if (0 < (int)inch) {
                uVar45 = uVar40;
              }
              uVar40 = 0;
              if (0 < (int)uVar33) {
                uVar40 = (ulong)uVar33;
              }
              for (; uVar41 != uVar40; uVar41 = uVar41 + 1) {
                lVar38 = (long)(int)(inch * 9 * (int)uVar41) * 4 +
                         *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
                lVar21 = (long)iStack_10c * (long)local_128;
                pp_Var29 = (_func_int **)
                           ((long)local_128 * local_f8[0] * uVar41 + (long)pd._vptr_ParamDict);
                for (uVar20 = 0; uVar20 != uVar45; uVar20 = uVar20 + 1) {
                  lVar22 = uVar20 * 0x24;
                  fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
                  uVar23 = *(uint *)(lVar38 + 0x1c + lVar22);
                  uVar3 = *(uint *)(lVar38 + 0x20 + lVar22);
                  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                          ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
                  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                          ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
                  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                          ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
                  for (lVar22 = 8; lVar22 != 0x38; lVar22 = lVar22 + 0xc) {
                    uVar25 = *(ulong *)(&UNK_004c6b68 + lVar22);
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar25;
                    auVar84._0_4_ = (float)uVar25 * auVar14._0_4_;
                    auVar84._4_4_ = (float)(uVar25 >> 0x20) * auVar14._4_4_;
                    auVar84._8_4_ = auVar14._8_4_ * 0.0;
                    auVar84._12_4_ = auVar14._12_4_ * 0.0;
                    auVar81 = vshufps_avx(auVar84,auVar84,0xe1);
                    auVar81 = vfmadd231ps_fma(auVar81,auVar70,auVar53);
                    uVar4 = *(undefined4 *)((long)&DAT_004c6b70 + lVar22);
                    auVar98._4_4_ = uVar4;
                    auVar98._0_4_ = uVar4;
                    auVar98._8_4_ = uVar4;
                    auVar98._12_4_ = uVar4;
                    auVar81 = vfmadd231ps_fma(auVar81,auVar98,auVar54);
                    uVar6 = vmovlps_avx(auVar81);
                    *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
                    auVar81 = vmovshdup_avx(auVar70);
                    auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar23),
                                              ZEXT416((uint)((float)uVar25 * fVar2)));
                    auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar98);
                    *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
                  }
                  pp_Var39 = pp_Var29;
                  for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                    uVar23 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
                    uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
                    puVar35 = (undefined8 *)((long)&DAT_004c6b70 + 4);
                    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                      auVar56._0_4_ = (float)*puVar35 * (float)uVar6;
                      auVar56._4_4_ =
                           (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
                      auVar56._8_8_ = 0;
                      auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar56,
                                                ZEXT416(uVar23));
                      auVar53 = vmovshdup_avx(auVar56);
                      *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
                      puVar35 = (undefined8 *)((long)puVar35 + 0xc);
                    }
                    pp_Var39 = pp_Var39 + 2;
                  }
                  pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
                }
              }
              Mat::create(&this->weight_winograd23_data,inch << 3,0x10,
                          (int)uVar33 / 8 + (int)uVar33 % 4 +
                          (int)(char)((char)((long)(int)uVar33 % 8) / '\x04'),4,(Allocator *)0x0);
              iVar34 = (this->weight_winograd23_data).w;
              pvVar28 = (this->weight_winograd23_data).data;
              sVar11 = (this->weight_winograd23_data).elemsize;
              sVar12 = (this->weight_winograd23_data).cstep;
              for (uVar40 = 0; (long)(uVar40 | 7) < lVar27; uVar40 = uVar40 + 8) {
                lVar38 = 0;
                for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
                  lVar22 = (long)pvVar28 +
                           (long)iVar34 * sVar11 * lVar21 + (uVar40 >> 3) * sVar12 * sVar11;
                  puVar43 = (undefined4 *)
                            ((long)local_128 * local_f8[0] * uVar40 + lVar38 +
                            (long)pd._vptr_ParamDict);
                  for (uVar41 = 0; uVar41 != uVar45; uVar41 = uVar41 + 1) {
                    puVar30 = puVar43;
                    for (lVar24 = 0; lVar24 != 0x20; lVar24 = lVar24 + 4) {
                      *(undefined4 *)(lVar22 + lVar24) = *puVar30;
                      puVar30 = (undefined4 *)((long)puVar30 + (long)local_128 * local_f8[0]);
                    }
                    puVar43 = (undefined4 *)((long)puVar43 + (long)iStack_10c * (long)local_128);
                    lVar22 = lVar22 + 0x20;
                  }
                  lVar38 = lVar38 + 4;
                }
              }
              iVar34 = (this->weight_winograd23_data).w;
              pvVar28 = (this->weight_winograd23_data).data;
              sVar11 = (this->weight_winograd23_data).elemsize;
              sVar12 = (this->weight_winograd23_data).cstep;
              for (; (long)(uVar40 | 3) < lVar27; uVar40 = uVar40 + 4) {
                lVar38 = 0;
                for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
                  lVar22 = (long)pvVar28 +
                           (long)iVar34 * sVar11 * lVar21 +
                           (ulong)(((uint)(uVar40 >> 3) & 0x1fffffff) +
                                  (uint)(((uint)uVar40 >> 2 & 1) != 0)) * sVar12 * sVar11;
                  puVar43 = (undefined4 *)
                            ((long)local_128 * local_f8[0] * uVar40 + lVar38 +
                            (long)pd._vptr_ParamDict);
                  for (uVar41 = 0; uVar41 != uVar45; uVar41 = uVar41 + 1) {
                    puVar30 = puVar43;
                    for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 4) {
                      *(undefined4 *)(lVar22 + lVar24) = *puVar30;
                      puVar30 = (undefined4 *)((long)puVar30 + (long)local_128 * local_f8[0]);
                    }
                    puVar43 = (undefined4 *)((long)puVar43 + (long)iStack_10c * (long)local_128);
                    lVar22 = lVar22 + 0x10;
                  }
                  lVar38 = lVar38 + 4;
                }
              }
              iVar34 = (this->weight_winograd23_data).w;
              pvVar28 = (this->weight_winograd23_data).data;
              sVar11 = (this->weight_winograd23_data).elemsize;
              sVar12 = (this->weight_winograd23_data).cstep;
              uVar41 = uVar40 & 0xffffffff;
              while( true ) {
                uVar33 = (uint)uVar41;
                if (lVar27 <= (long)uVar40) break;
                pvVar36 = (void *)((ulong)((uVar33 & 3) + (int)(uVar41 >> 3) +
                                          (uint)((uVar33 >> 2 & 1) != 0)) * sVar11 * sVar12 +
                                  (long)pvVar28);
                lVar38 = 0;
                for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
                  puVar43 = (undefined4 *)
                            (local_f8[0] * uVar40 * (long)local_128 + lVar38 +
                            (long)pd._vptr_ParamDict);
                  for (uVar41 = 0; uVar45 != uVar41; uVar41 = uVar41 + 1) {
                    *(undefined4 *)((long)pvVar36 + uVar41 * 4) = *puVar43;
                    puVar43 = (undefined4 *)((long)puVar43 + (long)iStack_10c * (long)local_128);
                  }
                  lVar38 = lVar38 + 4;
                  pvVar36 = (void *)((long)pvVar36 + (long)iVar34 * sVar11);
                }
                uVar40 = uVar40 + 1;
                uVar41 = (ulong)(uVar33 + 1);
              }
              piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
              opt = local_190;
              if (piVar8 == (int *)0x0) goto LAB_001ac082;
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 != 0) goto LAB_001ac082;
              pp_Var29 = pd._vptr_ParamDict;
              if (local_118 != (Allocator *)0x0) {
                (*local_118->_vptr_Allocator[3])();
                opt = local_190;
                goto LAB_001ac082;
              }
            }
            goto LAB_001b0ad7;
          }
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var46 != (_func_int *)0xfffffffffffffeb0) {
          piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          piVar8 = (this->weight_data_tm).refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              pAVar9 = (this->weight_data_tm).allocator;
              if (pAVar9 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar9->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          p_Var1 = (_func_int *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
          piVar8 = *(int **)(p_Var1 + 8);
          (this->weight_data_tm).data = *(void **)p_Var1;
          (this->weight_data_tm).refcount = piVar8;
          (this->weight_data_tm).elemsize =
               *(size_t *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var46);
          (this->weight_data_tm).elempack =
               *(int *)((long)&this->convolution_dilation1 + (long)p_Var46);
          (this->weight_data_tm).allocator =
               *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var46);
          p_Var1 = (_func_int *)((long)&(this->scale_in_data).refcount + (long)p_Var46);
          uVar6 = *(undefined8 *)p_Var1;
          uVar15 = *(undefined8 *)(p_Var1 + 8);
          (this->weight_data_tm).dims = (int)uVar6;
          (this->weight_data_tm).w = (int)((ulong)uVar6 >> 0x20);
          (this->weight_data_tm).h = (int)uVar15;
          (this->weight_data_tm).d = (int)((ulong)uVar15 >> 0x20);
          (this->weight_data_tm).c = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var46)
          ;
          (this->weight_data_tm).cstep =
               *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var46);
        }
        goto LAB_001ac082;
      }
      iVar37 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
    }
    convolution_im2col_sgemm_transform_kernel_sse
              ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
               &this->weight_sgemm_data,inch,iVar37,iVar34,iVar19);
  }
  else {
    if ((uVar45 & 0xf) == 0) {
      cVar44 = '\x10';
    }
    else {
      cVar44 = '\b';
      if ((uVar45 & 7) != 0) {
        cVar44 = ((uVar45 & 3) == 0) * '\x03' + '\x01';
      }
    }
    if ((uVar41 & 0xf) != 0) {
      if ((uVar33 & 7) == 0) {
        cVar16 = '\b';
      }
      else {
        cVar16 = ((uVar33 & 3) == 0) * '\x03' + '\x01';
      }
      goto LAB_001ab7a3;
    }
    if (cVar44 == '\x01') {
      if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)
                  ))) || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) ==
                             1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                           (long)p_Var46) == 1)) &&
                           (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var46 + 4)) == 2)) &&
                          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2
                          )))))) {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 1;
        iVar37 = iVar34;
LAB_001abdd4:
        convolution_im2col_sgemm_transform_kernel_pack1to16_avx512
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                   &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
        goto LAB_001ac082;
      }
      uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
      iVar37 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
      if (opt->use_sgemm_convolution == true) goto LAB_001abdd4;
      out_elempack = 0x10;
      iVar19 = 1;
LAB_001ac07b:
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_data_tm,inch,uVar33,iVar34,iVar37,iVar19,out_elempack);
      goto LAB_001ac082;
    }
    if (cVar44 == '\x04') {
      if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)
                  ))) || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) ==
                            1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                          (long)p_Var46) == 1)) &&
                          ((*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var46 + 4)) == 2 &&
                           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) ==
                            2)))))))) {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 1;
        iVar37 = iVar34;
      }
      else {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
        if (opt->use_sgemm_convolution != true) {
          out_elempack = 0x10;
          iVar19 = 4;
          goto LAB_001ac07b;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack4to16_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
      goto LAB_001ac082;
    }
    if (cVar44 == '\b') {
      if (((iVar34 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)
                  ))) || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) ==
                             1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                           (long)p_Var46) == 1)) &&
                           (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var46 + 4)) == 2)) &&
                          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2
                          )))))) {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar34 = 1;
        iVar37 = iVar34;
      }
      else {
        uVar33 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var46);
        iVar37 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var46);
        if (opt->use_sgemm_convolution != true) {
          out_elempack = 0x10;
          iVar19 = 8;
          goto LAB_001ac07b;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack8to16_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
      goto LAB_001ac082;
    }
    if (cVar44 != '\x10') goto LAB_001ac082;
    if (((iVar37 == 1 && iVar34 == 1) &&
        (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) == 1)) &&
       (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 1 &&
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 1)))) ||
        ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) == 1 &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) == 2 &&
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) == 2)))))))) {
      iVar34 = 1;
      iVar37 = iVar34;
LAB_001ad7db:
      convolution_im2col_sgemm_transform_kernel_pack16_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var46),
                 &this->weight_sgemm_data,inch,uVar33,iVar34,iVar37);
      goto LAB_001ac082;
    }
    if (opt->use_winograd_convolution != true) {
LAB_001ad7c0:
      if (opt->use_sgemm_convolution != true) {
        iVar19 = 0x10;
        out_elempack = iVar19;
        goto LAB_001ac07b;
      }
      goto LAB_001ad7db;
    }
    bVar13 = opt->use_winograd23_convolution;
    if ((bVar13 == false) && (opt->use_winograd43_convolution == false)) {
      if ((iVar37 == 3) && ((iVar34 == 3 && (opt->use_winograd63_convolution != false))))
      goto LAB_001ad56f;
      goto LAB_001ad7c0;
    }
    if (iVar37 != 3 || iVar34 != 3) goto LAB_001ad7c0;
LAB_001ad56f:
    if ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var46) != 1) ||
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var46) != 1)) ||
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var46 + 4)) != 1)) ||
       (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var46) != 1))
    goto LAB_001ad7c0;
    iVar34 = (int)uVar33 >> 4;
    if (((opt->use_winograd63_convolution == true) && (0x1f < (int)inch)) &&
       ((uVar33 - 0x20 < 0x61 && (inch < 0x81)))) {
LAB_001ae52f:
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      uVar20 = 0;
      local_190 = opt;
      Mat::create((Mat *)&pd_5,0x40,inch,uVar33,4,(Allocator *)0x0);
      uVar45 = uVar40;
      if ((int)inch < 1) {
        uVar45 = 0;
      }
      uVar25 = 0;
      if (0 < (int)uVar33) {
        uVar25 = (ulong)uVar33;
      }
      for (; uVar20 != uVar25; uVar20 = uVar20 + 1) {
        lVar38 = (long)(int)(inch * 9 * (int)uVar20) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        for (uVar26 = 0; uVar26 != uVar45; uVar26 = uVar26 + 1) {
          lVar21 = uVar26 * 0x24;
          fVar2 = *(float *)(lVar38 + 0x18 + lVar21);
          uVar33 = *(uint *)(lVar38 + 0x1c + lVar21);
          uVar3 = *(uint *)(lVar38 + 0x20 + lVar21);
          auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar21)),
                                  ZEXT416(*(uint *)(lVar38 + 0x10 + lVar21)),0x10);
          auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar21)),
                                  ZEXT416(*(uint *)(lVar38 + 4 + lVar21)),0x10);
          auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar21)),
                                  ZEXT416(*(uint *)(lVar38 + 0x14 + lVar21)),0x10);
          for (lVar21 = 8; lVar21 != 0x68; lVar21 = lVar21 + 0xc) {
            uVar7 = *(ulong *)("N4ncnn22Convolution_x86_avx512E" + lVar21 + 0x1e);
            auVar69._8_8_ = 0;
            auVar69._0_8_ = uVar7;
            auVar83._0_4_ = (float)uVar7 * auVar14._0_4_;
            auVar83._4_4_ = (float)(uVar7 >> 0x20) * auVar14._4_4_;
            auVar83._8_4_ = auVar14._8_4_ * 0.0;
            auVar83._12_4_ = auVar14._12_4_ * 0.0;
            auVar81 = vshufps_avx(auVar83,auVar83,0xe1);
            auVar81 = vfmadd231ps_fma(auVar81,auVar69,auVar53);
            uVar4 = *(undefined4 *)((long)&DAT_004c6ac0 + lVar21);
            auVar97._4_4_ = uVar4;
            auVar97._0_4_ = uVar4;
            auVar97._8_4_ = uVar4;
            auVar97._12_4_ = uVar4;
            auVar81 = vfmadd231ps_fma(auVar81,auVar97,auVar54);
            uVar6 = vmovlps_avx(auVar81);
            *(undefined8 *)((long)&uStack_140 + lVar21) = uVar6;
            auVar81 = vmovshdup_avx(auVar69);
            auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar33),ZEXT416((uint)((float)uVar7 * fVar2)))
            ;
            auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar97);
            *(int *)((long)&pd._vptr_ParamDict + lVar21) = auVar81._0_4_;
          }
          pp_Var29 = pd_5._vptr_ParamDict;
          for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
            uVar33 = *(uint *)((long)&pd._vptr_ParamDict + lVar21 * 0xc);
            uVar6 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21 * 0xc + 4);
            puVar35 = (undefined8 *)((long)&DAT_004c6ac0 + 4);
            for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
              auVar55._0_4_ = (float)*puVar35 * (float)uVar6;
              auVar55._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar55._8_8_ = 0;
              auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar55,
                                        ZEXT416(uVar33));
              auVar53 = vmovshdup_avx(auVar55);
              *(float *)((long)pp_Var29 + lVar22 * 4) = auVar14._0_4_ + auVar53._0_4_;
              puVar35 = (undefined8 *)((long)puVar35 + 0xc);
            }
            pp_Var29 = pp_Var29 + 4;
          }
        }
      }
      Mat::create(&this->weight_winograd63_data,(int)((long)((ulong)uVar23 << 0x20 | uVar40) / 0x10)
                  ,0x40,iVar34,0x400,0x100,(Allocator *)0x0);
      iVar34 = (this->weight_winograd63_data).w;
      pvVar28 = (this->weight_winograd63_data).data;
      sVar11 = (this->weight_winograd63_data).elemsize;
      sVar12 = (this->weight_winograd63_data).cstep;
      for (uVar45 = 0; (long)(uVar45 | 0xf) < (long)uVar41; uVar45 = uVar45 + 0x10) {
        lVar38 = 0;
        for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
          lVar22 = (long)pvVar28 + (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 4) * sVar12 * sVar11;
          for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar27; uVar40 = uVar40 + 0x10) {
            for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
              for (lVar32 = 0; lVar32 != 0x40; lVar32 = lVar32 + 4) {
                *(undefined4 *)(lVar22 + lVar32) =
                     *(undefined4 *)(lVar38 + (long)pd_5._vptr_ParamDict);
              }
              lVar22 = lVar22 + 0x40;
            }
          }
          lVar38 = lVar38 + 4;
        }
      }
      piVar8 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      opt = local_190;
      if (piVar8 == (int *)0x0) goto LAB_001ac082;
      LOCK();
      *piVar8 = *piVar8 + -1;
      iVar34 = *piVar8;
      UNLOCK();
      goto joined_r0x001ae84c;
    }
    if (opt->use_winograd43_convolution == false) {
      if (bVar13 != false) goto LAB_001ae36e;
      goto LAB_001ae52f;
    }
    if (((bVar13 | opt->use_winograd63_convolution) == 1) &&
       ((int)uVar33 < 0x20 || (int)inch < 0x20)) {
LAB_001ae36e:
      local_f8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_128 = (undefined1  [8])0x0;
      local_120 = 0;
      uVar20 = 0;
      local_190 = opt;
      local_118 = (Allocator *)pd._vptr_ParamDict;
      iStack_110 = (int)pd.d;
      iStack_10c = pd.d._4_4_;
      sStack_108 = (size_t)local_128;
      local_100[0] = local_120;
      Mat::create((Mat *)&pd,0x10,inch,uVar33,4,(Allocator *)0x0);
      uVar45 = uVar40;
      if ((int)inch < 1) {
        uVar45 = 0;
      }
      uVar25 = 0;
      if (0 < (int)uVar33) {
        uVar25 = (ulong)uVar33;
      }
      for (; uVar20 != uVar25; uVar20 = uVar20 + 1) {
        lVar38 = (long)(int)(inch * 9 * (int)uVar20) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        lVar21 = (long)iStack_10c * (long)local_128;
        pp_Var29 = (_func_int **)((long)local_128 * local_f8[0] * uVar20 + (long)pd._vptr_ParamDict)
        ;
        for (uVar26 = 0; uVar26 != uVar45; uVar26 = uVar26 + 1) {
          lVar22 = uVar26 * 0x24;
          fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
          uVar33 = *(uint *)(lVar38 + 0x1c + lVar22);
          uVar3 = *(uint *)(lVar38 + 0x20 + lVar22);
          auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                  ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
          auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
          auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
          for (lVar22 = 8; lVar22 != 0x38; lVar22 = lVar22 + 0xc) {
            uVar7 = *(ulong *)(&UNK_004c6b68 + lVar22);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = uVar7;
            auVar82._0_4_ = (float)uVar7 * auVar14._0_4_;
            auVar82._4_4_ = (float)(uVar7 >> 0x20) * auVar14._4_4_;
            auVar82._8_4_ = auVar14._8_4_ * 0.0;
            auVar82._12_4_ = auVar14._12_4_ * 0.0;
            auVar81 = vshufps_avx(auVar82,auVar82,0xe1);
            auVar81 = vfmadd231ps_fma(auVar81,auVar68,auVar53);
            uVar4 = *(undefined4 *)((long)&DAT_004c6b70 + lVar22);
            auVar96._4_4_ = uVar4;
            auVar96._0_4_ = uVar4;
            auVar96._8_4_ = uVar4;
            auVar96._12_4_ = uVar4;
            auVar81 = vfmadd231ps_fma(auVar81,auVar96,auVar54);
            uVar6 = vmovlps_avx(auVar81);
            *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
            auVar81 = vmovshdup_avx(auVar68);
            auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar33),ZEXT416((uint)((float)uVar7 * fVar2)))
            ;
            auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar96);
            *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
          }
          pp_Var39 = pp_Var29;
          for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
            uVar33 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
            uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
            puVar35 = (undefined8 *)((long)&DAT_004c6b70 + 4);
            for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
              auVar54._0_4_ = (float)*puVar35 * (float)uVar6;
              auVar54._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar54._8_8_ = 0;
              auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar54,
                                        ZEXT416(uVar33));
              auVar53 = vmovshdup_avx(auVar54);
              *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
              puVar35 = (undefined8 *)((long)puVar35 + 0xc);
            }
            pp_Var39 = pp_Var39 + 2;
          }
          pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
        }
      }
      Mat::create(&this->weight_winograd23_data,(int)((long)((ulong)uVar23 << 0x20 | uVar40) / 0x10)
                  ,0x10,iVar34,0x400,0x100,(Allocator *)0x0);
      iVar34 = (this->weight_winograd23_data).w;
      pvVar28 = (this->weight_winograd23_data).data;
      sVar11 = (this->weight_winograd23_data).elemsize;
      sVar12 = (this->weight_winograd23_data).cstep;
      for (uVar45 = 0; (long)(uVar45 | 0xf) < (long)uVar41; uVar45 = uVar45 + 0x10) {
        lVar38 = 0;
        for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
          lVar22 = (long)pvVar28 + (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 4) * sVar12 * sVar11;
          puVar43 = (undefined4 *)
                    (local_f8[0] * (long)local_128 * uVar45 + lVar38 + (long)pd._vptr_ParamDict);
          for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar27; uVar40 = uVar40 + 0x10) {
            puVar30 = puVar43;
            for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
              puVar31 = puVar30;
              for (lVar32 = 0; lVar32 != 0x40; lVar32 = lVar32 + 4) {
                *(undefined4 *)(lVar22 + lVar32) = *puVar31;
                puVar31 = (undefined4 *)((long)puVar31 + local_f8[0] * (long)local_128);
              }
              puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_10c * (long)local_128);
              lVar22 = lVar22 + 0x40;
            }
            puVar43 = puVar43 + (long)iStack_10c * (long)local_128 * 4;
          }
          lVar38 = lVar38 + 4;
        }
      }
      piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      opt = local_190;
      if (piVar8 == (int *)0x0) goto LAB_001ac082;
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 != 0) goto LAB_001ac082;
      pp_Var29 = pd._vptr_ParamDict;
      if (local_118 != (Allocator *)0x0) {
        (*local_118->_vptr_Allocator[3])();
        opt = local_190;
        goto LAB_001ac082;
      }
    }
    else {
      local_f8[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_128 = (undefined1  [8])0x0;
      local_120 = 0;
      uVar20 = 0;
      local_190 = opt;
      local_118 = (Allocator *)pd._vptr_ParamDict;
      iStack_110 = (int)pd.d;
      iStack_10c = pd.d._4_4_;
      sStack_108 = (size_t)local_128;
      local_100[0] = local_120;
      Mat::create((Mat *)&pd,0x24,inch,uVar33,4,(Allocator *)0x0);
      uVar45 = uVar40;
      if ((int)inch < 1) {
        uVar45 = 0;
      }
      uVar25 = 0;
      if (0 < (int)uVar33) {
        uVar25 = (ulong)uVar33;
      }
      for (; uVar20 != uVar25; uVar20 = uVar20 + 1) {
        lVar38 = (long)(int)(inch * 9 * (int)uVar20) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var46);
        lVar21 = (long)iStack_10c * (long)local_128;
        pp_Var29 = (_func_int **)((long)local_128 * local_f8[0] * uVar20 + (long)pd._vptr_ParamDict)
        ;
        for (uVar26 = 0; uVar26 != uVar45; uVar26 = uVar26 + 1) {
          lVar22 = uVar26 * 0x24;
          fVar2 = *(float *)(lVar38 + 0x18 + lVar22);
          uVar33 = *(uint *)(lVar38 + 0x1c + lVar22);
          uVar3 = *(uint *)(lVar38 + 0x20 + lVar22);
          auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + lVar22)),
                                  ZEXT416(*(uint *)(lVar38 + 0x10 + lVar22)),0x10);
          auVar14 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar38 + 4 + lVar22)),0x10);
          auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar38 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar38 + 0x14 + lVar22)),0x10);
          for (lVar22 = 8; lVar22 != 0x50; lVar22 = lVar22 + 0xc) {
            uVar7 = *(ulong *)(&UNK_004c6b18 + lVar22);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar7;
            auVar81._0_4_ = (float)uVar7 * auVar14._0_4_;
            auVar81._4_4_ = (float)(uVar7 >> 0x20) * auVar14._4_4_;
            auVar81._8_4_ = auVar14._8_4_ * 0.0;
            auVar81._12_4_ = auVar14._12_4_ * 0.0;
            auVar81 = vshufps_avx(auVar81,auVar81,0xe1);
            auVar81 = vfmadd231ps_fma(auVar81,auVar67,auVar53);
            uVar4 = *(undefined4 *)((long)&DAT_004c6b20 + lVar22);
            auVar95._4_4_ = uVar4;
            auVar95._0_4_ = uVar4;
            auVar95._8_4_ = uVar4;
            auVar95._12_4_ = uVar4;
            auVar81 = vfmadd231ps_fma(auVar81,auVar95,auVar54);
            uVar6 = vmovlps_avx(auVar81);
            *(undefined8 *)((long)&local_190 + lVar22) = uVar6;
            auVar81 = vmovshdup_avx(auVar67);
            auVar81 = vfmadd213ss_fma(auVar81,ZEXT416(uVar33),ZEXT416((uint)((float)uVar7 * fVar2)))
            ;
            auVar81 = vfmadd231ss_fma(auVar81,ZEXT416(uVar3),auVar95);
            *(int *)((long)&pd_5._vptr_ParamDict + lVar22) = auVar81._0_4_;
          }
          pp_Var39 = pp_Var29;
          for (lVar22 = 0; lVar22 != 6; lVar22 = lVar22 + 1) {
            uVar33 = *(uint *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc);
            uVar6 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar22 * 0xc + 4);
            puVar35 = (undefined8 *)((long)&DAT_004c6b20 + 4);
            for (lVar24 = 0; lVar24 != 6; lVar24 = lVar24 + 1) {
              auVar53._0_4_ = (float)*puVar35 * (float)uVar6;
              auVar53._4_4_ = (float)((ulong)*puVar35 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar53._8_8_ = 0;
              auVar14 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar35 + -4)),auVar53,
                                        ZEXT416(uVar33));
              auVar53 = vmovshdup_avx(auVar53);
              *(float *)((long)pp_Var39 + lVar24 * 4) = auVar14._0_4_ + auVar53._0_4_;
              puVar35 = (undefined8 *)((long)puVar35 + 0xc);
            }
            pp_Var39 = pp_Var39 + 3;
          }
          pp_Var29 = (_func_int **)((long)pp_Var29 + lVar21);
        }
      }
      Mat::create(&this->weight_winograd43_data,(int)((long)((ulong)uVar23 << 0x20 | uVar40) / 0x10)
                  ,0x24,iVar34,0x400,0x100,(Allocator *)0x0);
      iVar34 = (this->weight_winograd43_data).w;
      pvVar28 = (this->weight_winograd43_data).data;
      sVar11 = (this->weight_winograd43_data).elemsize;
      sVar12 = (this->weight_winograd43_data).cstep;
      for (uVar45 = 0; (long)(uVar45 | 0xf) < (long)uVar41; uVar45 = uVar45 + 0x10) {
        lVar38 = 0;
        for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 1) {
          lVar22 = (long)pvVar28 + (long)iVar34 * sVar11 * lVar21 + (uVar45 >> 4) * sVar12 * sVar11;
          puVar43 = (undefined4 *)
                    (local_f8[0] * (long)local_128 * uVar45 + lVar38 + (long)pd._vptr_ParamDict);
          for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar27; uVar40 = uVar40 + 0x10) {
            puVar30 = puVar43;
            for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
              puVar31 = puVar30;
              for (lVar32 = 0; lVar32 != 0x40; lVar32 = lVar32 + 4) {
                *(undefined4 *)(lVar22 + lVar32) = *puVar31;
                puVar31 = (undefined4 *)((long)puVar31 + local_f8[0] * (long)local_128);
              }
              puVar30 = (undefined4 *)((long)puVar30 + (long)iStack_10c * (long)local_128);
              lVar22 = lVar22 + 0x40;
            }
            puVar43 = puVar43 + (long)iStack_10c * (long)local_128 * 4;
          }
          lVar38 = lVar38 + 4;
        }
      }
      piVar8 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      opt = local_190;
      if (piVar8 == (int *)0x0) goto LAB_001ac082;
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 != 0) goto LAB_001ac082;
      pp_Var29 = pd._vptr_ParamDict;
      if (local_118 != (Allocator *)0x0) {
        (*local_118->_vptr_Allocator[3])();
        opt = local_190;
        goto LAB_001ac082;
      }
    }
LAB_001b0ad7:
    free(pp_Var29);
    opt = local_190;
  }
LAB_001ac082:
  if (opt->lightmode == true) {
    p_Var46 = this->_vptr_Convolution_x86_avx512[-3];
    piVar8 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var46);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        plVar10 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var46);
        if (plVar10 == (long *)0x0) {
          free(*(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var46));
        }
        else {
          (**(code **)(*plVar10 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var46) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var46 + 4)) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var46) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var46) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var46) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}